

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::SubGridMBIntersector1Pluecker<8,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  ushort uVar6;
  ushort uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  byte bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  AABBNodeMB4D *node1;
  ulong uVar60;
  long lVar61;
  ulong uVar62;
  long lVar63;
  long lVar64;
  Geometry *pGVar65;
  long lVar66;
  RTCIntersectArguments *pRVar67;
  ulong uVar68;
  int iVar69;
  ulong uVar70;
  uint uVar71;
  long lVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar87;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar86;
  undefined1 auVar85 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar95;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar93 [32];
  float fVar96;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar94 [64];
  float fVar97;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar108;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar109;
  undefined1 auVar107 [64];
  float fVar110;
  float fVar124;
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar125;
  undefined1 auVar123 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar126;
  float fVar138;
  float fVar139;
  undefined1 auVar127 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar140;
  undefined1 auVar135 [32];
  float fVar144;
  undefined1 auVar136 [32];
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar137 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar145 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar146 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar160;
  float fVar161;
  undefined1 auVar167 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar174;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar180;
  float fVar182;
  float fVar184;
  undefined1 auVar171 [32];
  float fVar173;
  float fVar175;
  float fVar179;
  float fVar181;
  float fVar183;
  undefined1 auVar172 [64];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar185;
  undefined1 auVar191 [16];
  undefined1 auVar186 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar187 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar188 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar205;
  float fVar208;
  float fVar210;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar203;
  float fVar204;
  float fVar206;
  float fVar207;
  float fVar209;
  undefined1 auVar202 [64];
  float fVar211;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar228;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar226;
  float fVar227;
  float fVar229;
  float fVar230;
  undefined1 auVar225 [64];
  float fVar231;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar241;
  float fVar245;
  undefined1 auVar237 [32];
  float fVar239;
  float fVar240;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar238 [64];
  float fVar246;
  float fVar247;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar254 [64];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  float fVar272;
  float fVar278;
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  float fVar276;
  float fVar277;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar275 [64];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [64];
  float fVar285;
  float fVar286;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar287 [64];
  float fVar300;
  float fVar301;
  undefined1 auVar302 [32];
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar303 [64];
  UVIdentity<8> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  NodeRef stack [564];
  undefined1 local_1841;
  RayQueryContext *local_1840;
  Ray *local_1838;
  uint local_182c;
  uint local_1828;
  int local_1824;
  undefined1 local_1820 [32];
  undefined1 local_17f0 [16];
  undefined1 local_17e0 [32];
  undefined1 local_17c0 [32];
  undefined8 local_17a0;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  undefined8 local_1780;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  ulong local_1758;
  ulong local_1750;
  ulong local_1748;
  long local_1740;
  long local_1738;
  long local_1730;
  ulong *local_1728;
  ulong local_1720;
  long local_1718;
  long local_1710;
  Scene *local_1708;
  float local_1700;
  float local_16fc;
  float local_16f8;
  undefined4 local_16f4;
  undefined4 local_16f0;
  undefined4 local_16ec;
  undefined4 local_16e8;
  uint local_16e4;
  uint local_16e0;
  RTCFilterFunctionNArguments local_16d0;
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [8];
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  undefined1 local_1580 [8];
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  undefined1 local_1560 [8];
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 *local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  ulong local_1200;
  ulong local_11f8 [569];
  
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200 != 8) {
    fVar160 = ray->tfar;
    if (0.0 <= fVar160) {
      local_1728 = local_11f8;
      aVar4 = (ray->dir).field_0;
      auVar78 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar77._8_4_ = 0x7fffffff;
      auVar77._0_8_ = 0x7fffffff7fffffff;
      auVar77._12_4_ = 0x7fffffff;
      auVar77 = vandps_avx((undefined1  [16])aVar4,auVar77);
      auVar149._8_4_ = 0x219392ef;
      auVar149._0_8_ = 0x219392ef219392ef;
      auVar149._12_4_ = 0x219392ef;
      auVar77 = vcmpps_avx(auVar77,auVar149,1);
      auVar127._8_4_ = 0x3f800000;
      auVar127._0_8_ = 0x3f8000003f800000;
      auVar127._12_4_ = 0x3f800000;
      auVar149 = vdivps_avx(auVar127,(undefined1  [16])aVar4);
      auVar80._8_4_ = 0x5d5e0b6b;
      auVar80._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar80._12_4_ = 0x5d5e0b6b;
      auVar77 = vblendvps_avx(auVar149,auVar80,auVar77);
      auVar111._0_4_ = auVar77._0_4_ * 0.99999964;
      auVar111._4_4_ = auVar77._4_4_ * 0.99999964;
      auVar111._8_4_ = auVar77._8_4_ * 0.99999964;
      auVar111._12_4_ = auVar77._12_4_ * 0.99999964;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_1500._4_4_ = uVar3;
      local_1500._0_4_ = uVar3;
      local_1500._8_4_ = uVar3;
      local_1500._12_4_ = uVar3;
      local_1500._16_4_ = uVar3;
      local_1500._20_4_ = uVar3;
      local_1500._24_4_ = uVar3;
      local_1500._28_4_ = uVar3;
      auVar303 = ZEXT3264(local_1500);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_15c0._4_4_ = uVar3;
      local_15c0._0_4_ = uVar3;
      local_15c0._8_4_ = uVar3;
      local_15c0._12_4_ = uVar3;
      local_15c0._16_4_ = uVar3;
      local_15c0._20_4_ = uVar3;
      local_15c0._24_4_ = uVar3;
      local_15c0._28_4_ = uVar3;
      auVar284 = ZEXT3264(local_15c0);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_14a0._4_4_ = uVar3;
      local_14a0._0_4_ = uVar3;
      local_14a0._8_4_ = uVar3;
      local_14a0._12_4_ = uVar3;
      local_14a0._16_4_ = uVar3;
      local_14a0._20_4_ = uVar3;
      local_14a0._24_4_ = uVar3;
      local_14a0._28_4_ = uVar3;
      auVar172 = ZEXT3264(local_14a0);
      auVar101._0_4_ = auVar77._0_4_ * 1.0000004;
      auVar101._4_4_ = auVar77._4_4_ * 1.0000004;
      auVar101._8_4_ = auVar77._8_4_ * 1.0000004;
      auVar101._12_4_ = auVar77._12_4_ * 1.0000004;
      auVar77 = vshufps_avx(auVar111,auVar111,0);
      register0x000013d0 = auVar77;
      _local_1560 = auVar77;
      auVar202 = ZEXT3264(_local_1560);
      auVar77 = vmovshdup_avx(auVar111);
      auVar137 = ZEXT1664(auVar77);
      auVar149 = vshufps_avx(auVar111,auVar111,0x55);
      register0x00001410 = auVar149;
      _local_1580 = auVar149;
      auVar225 = ZEXT3264(_local_1580);
      auVar149 = vshufpd_avx(auVar111,auVar111,1);
      auVar127 = vshufps_avx(auVar111,auVar111,0xaa);
      register0x00001450 = auVar127;
      _local_15a0 = auVar127;
      auVar238 = ZEXT3264(_local_15a0);
      auVar127 = vshufps_avx(auVar101,auVar101,0);
      local_14c0._16_16_ = auVar127;
      local_14c0._0_16_ = auVar127;
      auVar254 = ZEXT3264(local_14c0);
      auVar127 = vshufps_avx(auVar101,auVar101,0x55);
      auVar123 = ZEXT1664(auVar127);
      local_14e0._16_16_ = auVar127;
      local_14e0._0_16_ = auVar127;
      auVar271 = ZEXT3264(local_14e0);
      auVar127 = vshufps_avx(auVar101,auVar101,0xaa);
      auVar107 = ZEXT1664(auVar127);
      local_15e0._16_16_ = auVar127;
      local_15e0._0_16_ = auVar127;
      auVar287 = ZEXT3264(local_15e0);
      uVar70 = (ulong)(auVar111._0_4_ < 0.0) << 5;
      uVar73 = (ulong)(auVar77._0_4_ < 0.0) << 5 | 0x40;
      uVar74 = (ulong)(auVar149._0_4_ < 0.0) << 5 | 0x80;
      uVar75 = uVar70 ^ 0x20;
      uVar76 = uVar73 ^ 0x20;
      auVar77 = vshufps_avx(auVar78,auVar78,0);
      auVar94 = ZEXT1664(auVar77);
      local_1440 = ZEXT1632(auVar77);
      local_1600._16_16_ = auVar77;
      local_1600._0_16_ = auVar77;
      auVar275 = ZEXT3264(local_1600);
      auVar77 = vshufps_avx(ZEXT416((uint)fVar160),ZEXT416((uint)fVar160),0);
      local_1460 = ZEXT1632(auVar77);
      local_1620._16_16_ = auVar77;
      local_1620._0_16_ = auVar77;
      auVar159 = ZEXT3264(local_1620);
      local_1540._16_16_ = mm_lookupmask_ps._240_16_;
      local_1540._0_16_ = mm_lookupmask_ps._240_16_;
      local_1480 = vperm2f128_avx(local_1540,mm_lookupmask_ps._0_32_,2);
      local_1750 = uVar70;
      local_1758 = uVar73;
      local_1840 = context;
      local_1838 = ray;
      do {
        uVar68 = local_1728[-1];
        local_1728 = local_1728 + -1;
        while ((uVar68 & 8) == 0) {
          uVar60 = uVar68 & 0xfffffffffffffff0;
          fVar160 = (ray->dir).field_0.m128[3];
          auVar82._4_4_ = fVar160;
          auVar82._0_4_ = fVar160;
          auVar82._8_4_ = fVar160;
          auVar82._12_4_ = fVar160;
          auVar82._16_4_ = fVar160;
          auVar82._20_4_ = fVar160;
          auVar82._24_4_ = fVar160;
          auVar82._28_4_ = fVar160;
          pfVar2 = (float *)(uVar60 + 0x100 + uVar70);
          pfVar1 = (float *)(uVar60 + 0x40 + uVar70);
          auVar90._0_4_ = fVar160 * *pfVar2 + *pfVar1;
          auVar90._4_4_ = fVar160 * pfVar2[1] + pfVar1[1];
          auVar90._8_4_ = fVar160 * pfVar2[2] + pfVar1[2];
          auVar90._12_4_ = fVar160 * pfVar2[3] + pfVar1[3];
          auVar90._16_4_ = fVar160 * pfVar2[4] + pfVar1[4];
          auVar90._20_4_ = fVar160 * pfVar2[5] + pfVar1[5];
          auVar90._24_4_ = fVar160 * pfVar2[6] + pfVar1[6];
          auVar90._28_4_ = auVar94._28_4_ + pfVar1[7];
          auVar14 = vsubps_avx(auVar90,auVar303._0_32_);
          pfVar2 = (float *)(uVar60 + 0x100 + uVar73);
          pfVar1 = (float *)(uVar60 + 0x40 + uVar73);
          auVar104._0_4_ = fVar160 * *pfVar2 + *pfVar1;
          auVar104._4_4_ = fVar160 * pfVar2[1] + pfVar1[1];
          auVar104._8_4_ = fVar160 * pfVar2[2] + pfVar1[2];
          auVar104._12_4_ = fVar160 * pfVar2[3] + pfVar1[3];
          auVar104._16_4_ = fVar160 * pfVar2[4] + pfVar1[4];
          auVar104._20_4_ = fVar160 * pfVar2[5] + pfVar1[5];
          auVar104._24_4_ = fVar160 * pfVar2[6] + pfVar1[6];
          auVar104._28_4_ = auVar107._28_4_ + pfVar1[7];
          auVar12._4_4_ = auVar202._4_4_ * auVar14._4_4_;
          auVar12._0_4_ = auVar202._0_4_ * auVar14._0_4_;
          auVar12._8_4_ = auVar202._8_4_ * auVar14._8_4_;
          auVar12._12_4_ = auVar202._12_4_ * auVar14._12_4_;
          auVar12._16_4_ = auVar202._16_4_ * auVar14._16_4_;
          auVar12._20_4_ = auVar202._20_4_ * auVar14._20_4_;
          auVar12._24_4_ = auVar202._24_4_ * auVar14._24_4_;
          auVar12._28_4_ = auVar14._28_4_;
          auVar14 = vsubps_avx(auVar104,auVar284._0_32_);
          pfVar2 = (float *)(uVar60 + 0x100 + uVar74);
          auVar13._4_4_ = auVar225._4_4_ * auVar14._4_4_;
          auVar13._0_4_ = auVar225._0_4_ * auVar14._0_4_;
          auVar13._8_4_ = auVar225._8_4_ * auVar14._8_4_;
          auVar13._12_4_ = auVar225._12_4_ * auVar14._12_4_;
          auVar13._16_4_ = auVar225._16_4_ * auVar14._16_4_;
          auVar13._20_4_ = auVar225._20_4_ * auVar14._20_4_;
          auVar13._24_4_ = auVar225._24_4_ * auVar14._24_4_;
          auVar13._28_4_ = auVar14._28_4_;
          pfVar1 = (float *)(uVar60 + 0x40 + uVar74);
          auVar116._0_4_ = fVar160 * *pfVar2 + *pfVar1;
          auVar116._4_4_ = fVar160 * pfVar2[1] + pfVar1[1];
          auVar116._8_4_ = fVar160 * pfVar2[2] + pfVar1[2];
          auVar116._12_4_ = fVar160 * pfVar2[3] + pfVar1[3];
          auVar116._16_4_ = fVar160 * pfVar2[4] + pfVar1[4];
          auVar116._20_4_ = fVar160 * pfVar2[5] + pfVar1[5];
          auVar116._24_4_ = fVar160 * pfVar2[6] + pfVar1[6];
          auVar116._28_4_ = auVar123._28_4_ + pfVar1[7];
          auVar15 = vsubps_avx(auVar116,auVar172._0_32_);
          auVar14._4_4_ = auVar238._4_4_ * auVar15._4_4_;
          auVar14._0_4_ = auVar238._0_4_ * auVar15._0_4_;
          auVar14._8_4_ = auVar238._8_4_ * auVar15._8_4_;
          auVar14._12_4_ = auVar238._12_4_ * auVar15._12_4_;
          auVar14._16_4_ = auVar238._16_4_ * auVar15._16_4_;
          auVar14._20_4_ = auVar238._20_4_ * auVar15._20_4_;
          auVar14._24_4_ = auVar238._24_4_ * auVar15._24_4_;
          auVar14._28_4_ = auVar15._28_4_;
          auVar14 = vmaxps_avx(auVar13,auVar14);
          auVar12 = vmaxps_avx(auVar275._0_32_,auVar12);
          auVar13 = vmaxps_avx(auVar12,auVar14);
          pfVar2 = (float *)(uVar60 + 0x100 + uVar75);
          pfVar1 = (float *)(uVar60 + 0x40 + uVar75);
          auVar105._0_4_ = fVar160 * *pfVar2 + *pfVar1;
          auVar105._4_4_ = fVar160 * pfVar2[1] + pfVar1[1];
          auVar105._8_4_ = fVar160 * pfVar2[2] + pfVar1[2];
          auVar105._12_4_ = fVar160 * pfVar2[3] + pfVar1[3];
          auVar105._16_4_ = fVar160 * pfVar2[4] + pfVar1[4];
          auVar105._20_4_ = fVar160 * pfVar2[5] + pfVar1[5];
          auVar105._24_4_ = fVar160 * pfVar2[6] + pfVar1[6];
          auVar105._28_4_ = auVar14._28_4_ + pfVar1[7];
          auVar14 = vsubps_avx(auVar105,auVar303._0_32_);
          auVar16._4_4_ = auVar254._4_4_ * auVar14._4_4_;
          auVar16._0_4_ = auVar254._0_4_ * auVar14._0_4_;
          auVar16._8_4_ = auVar254._8_4_ * auVar14._8_4_;
          auVar16._12_4_ = auVar254._12_4_ * auVar14._12_4_;
          auVar16._16_4_ = auVar254._16_4_ * auVar14._16_4_;
          auVar16._20_4_ = auVar254._20_4_ * auVar14._20_4_;
          auVar16._24_4_ = auVar254._24_4_ * auVar14._24_4_;
          auVar16._28_4_ = auVar14._28_4_;
          pfVar2 = (float *)(uVar60 + 0x100 + uVar76);
          pfVar1 = (float *)(uVar60 + 0x40 + uVar76);
          auVar117._0_4_ = fVar160 * *pfVar2 + *pfVar1;
          auVar117._4_4_ = fVar160 * pfVar2[1] + pfVar1[1];
          auVar117._8_4_ = fVar160 * pfVar2[2] + pfVar1[2];
          auVar117._12_4_ = fVar160 * pfVar2[3] + pfVar1[3];
          auVar117._16_4_ = fVar160 * pfVar2[4] + pfVar1[4];
          auVar117._20_4_ = fVar160 * pfVar2[5] + pfVar1[5];
          auVar117._24_4_ = fVar160 * pfVar2[6] + pfVar1[6];
          auVar117._28_4_ = auVar15._28_4_ + pfVar1[7];
          auVar14 = vsubps_avx(auVar117,auVar284._0_32_);
          auVar15._4_4_ = auVar271._4_4_ * auVar14._4_4_;
          auVar15._0_4_ = auVar271._0_4_ * auVar14._0_4_;
          auVar15._8_4_ = auVar271._8_4_ * auVar14._8_4_;
          auVar15._12_4_ = auVar271._12_4_ * auVar14._12_4_;
          auVar15._16_4_ = auVar271._16_4_ * auVar14._16_4_;
          auVar15._20_4_ = auVar271._20_4_ * auVar14._20_4_;
          auVar15._24_4_ = auVar271._24_4_ * auVar14._24_4_;
          auVar15._28_4_ = auVar14._28_4_;
          pfVar2 = (float *)(uVar60 + 0x100 + (uVar74 ^ 0x20));
          pfVar1 = (float *)(uVar60 + 0x40 + (uVar74 ^ 0x20));
          auVar130._0_4_ = fVar160 * *pfVar2 + *pfVar1;
          auVar130._4_4_ = fVar160 * pfVar2[1] + pfVar1[1];
          auVar130._8_4_ = fVar160 * pfVar2[2] + pfVar1[2];
          auVar130._12_4_ = fVar160 * pfVar2[3] + pfVar1[3];
          auVar130._16_4_ = fVar160 * pfVar2[4] + pfVar1[4];
          auVar130._20_4_ = fVar160 * pfVar2[5] + pfVar1[5];
          auVar130._24_4_ = fVar160 * pfVar2[6] + pfVar1[6];
          auVar130._28_4_ = auVar137._28_4_ + pfVar1[7];
          auVar14 = vsubps_avx(auVar130,auVar172._0_32_);
          auVar17._4_4_ = auVar287._4_4_ * auVar14._4_4_;
          auVar17._0_4_ = auVar287._0_4_ * auVar14._0_4_;
          auVar17._8_4_ = auVar287._8_4_ * auVar14._8_4_;
          auVar17._12_4_ = auVar287._12_4_ * auVar14._12_4_;
          auVar17._16_4_ = auVar287._16_4_ * auVar14._16_4_;
          auVar17._20_4_ = auVar287._20_4_ * auVar14._20_4_;
          auVar17._24_4_ = auVar287._24_4_ * auVar14._24_4_;
          auVar17._28_4_ = auVar14._28_4_;
          auVar137 = ZEXT3264(auVar17);
          auVar14 = vminps_avx(auVar15,auVar17);
          auVar123 = ZEXT3264(auVar14);
          auVar12 = vminps_avx(auVar159._0_32_,auVar16);
          auVar12 = vminps_avx(auVar12,auVar14);
          auVar14 = vcmpps_avx(auVar13,auVar12,2);
          auVar94 = ZEXT3264(auVar14);
          if (((uint)uVar68 & 7) == 6) {
            auVar12 = vcmpps_avx(*(undefined1 (*) [32])(uVar60 + 0x1c0),auVar82,2);
            auVar13 = vcmpps_avx(auVar82,*(undefined1 (*) [32])(uVar60 + 0x1e0),1);
            auVar13 = vandps_avx(auVar12,auVar13);
            auVar14 = vandps_avx(auVar13,auVar14);
            auVar94 = ZEXT1664(auVar14._16_16_);
            auVar77 = vpackssdw_avx(auVar14._0_16_,auVar14._16_16_);
          }
          else {
            auVar77 = vpackssdw_avx(auVar14._0_16_,auVar14._16_16_);
          }
          auVar107 = ZEXT3264(auVar12);
          auVar77 = vpsllw_avx(auVar77,0xf);
          if ((((((((auVar77 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar77 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar77 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar77 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar77 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar77 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar77 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar77[0xf]) goto LAB_002f42be;
          auVar77 = vpacksswb_avx(auVar77,auVar77);
          bVar18 = SUB161(auVar77 >> 7,0) & 1 | (SUB161(auVar77 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar77 >> 0x17,0) & 1) << 2 | (SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar77 >> 0x27,0) & 1) << 4 | (SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar77 >> 0x37,0) & 1) << 6 | SUB161(auVar77 >> 0x3f,0) << 7;
          lVar72 = 0;
          if (bVar18 != 0) {
            for (; (bVar18 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
            }
          }
          uVar68 = *(ulong *)(uVar60 + lVar72 * 8);
          uVar71 = bVar18 - 1 & (uint)bVar18;
          if (uVar71 != 0) {
            *local_1728 = uVar68;
            local_1728 = local_1728 + 1;
            lVar72 = 0;
            if (uVar71 != 0) {
              for (; (uVar71 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
              }
            }
            uVar68 = *(ulong *)(uVar60 + lVar72 * 8);
            uVar71 = uVar71 - 1 & uVar71;
            uVar62 = (ulong)uVar71;
            if (uVar71 != 0) {
              do {
                *local_1728 = uVar68;
                local_1728 = local_1728 + 1;
                lVar72 = 0;
                if (uVar62 != 0) {
                  for (; (uVar62 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                  }
                }
                uVar68 = *(ulong *)(uVar60 + lVar72 * 8);
                uVar62 = uVar62 & uVar62 - 1;
              } while (uVar62 != 0);
            }
          }
        }
        local_1730 = (ulong)((uint)uVar68 & 0xf) - 8;
        if (local_1730 != 0) {
          uVar68 = uVar68 & 0xfffffffffffffff0;
          local_1738 = 0;
          do {
            lVar72 = local_1738 * 0xe0;
            uVar60 = *(ulong *)(uVar68 + 0x40 + lVar72);
            auVar78._8_8_ = 0;
            auVar78._0_8_ = uVar60;
            auVar77 = vpmovzxbd_avx(auVar78);
            uVar62 = *(ulong *)(uVar68 + 0x44 + lVar72);
            auVar112._8_8_ = 0;
            auVar112._0_8_ = uVar62;
            auVar149 = vpmovzxbd_avx(auVar112);
            auVar131._16_16_ = auVar149;
            auVar131._0_16_ = auVar77;
            auVar88._8_8_ = 0;
            auVar88._0_8_ = *(ulong *)(uVar68 + 0x48 + lVar72);
            auVar77 = vpmovzxbd_avx(auVar88);
            auVar162._8_8_ = 0;
            auVar162._0_8_ = *(ulong *)(uVar68 + 0x4c + lVar72);
            auVar149 = vpmovzxbd_avx(auVar162);
            auVar150._16_16_ = auVar149;
            auVar150._0_16_ = auVar77;
            auVar77 = vpminub_avx(auVar78,auVar88);
            auVar79._8_8_ = 0;
            auVar79._0_8_ = uVar60;
            local_17f0 = vpcmpeqb_avx(auVar79,auVar77);
            auVar77 = vpminub_avx(auVar112,auVar162);
            auVar113._8_8_ = 0;
            auVar113._0_8_ = uVar62;
            auVar77 = vpcmpeqb_avx(auVar113,auVar77);
            local_1820._0_16_ = auVar77;
            auVar14 = vcvtdq2ps_avx(auVar131);
            fVar160 = *(float *)(uVar68 + 0x7c + lVar72);
            fVar95 = *(float *)(uVar68 + 0x70 + lVar72);
            auVar118._0_4_ = fVar95 + fVar160 * auVar14._0_4_;
            auVar118._4_4_ = fVar95 + fVar160 * auVar14._4_4_;
            auVar118._8_4_ = fVar95 + fVar160 * auVar14._8_4_;
            auVar118._12_4_ = fVar95 + fVar160 * auVar14._12_4_;
            auVar118._16_4_ = fVar95 + fVar160 * auVar14._16_4_;
            auVar118._20_4_ = fVar95 + fVar160 * auVar14._20_4_;
            auVar118._24_4_ = fVar95 + fVar160 * auVar14._24_4_;
            auVar118._28_4_ = fVar95 + auVar14._28_4_;
            auVar186._8_8_ = 0;
            auVar186._0_8_ = *(ulong *)(uVar68 + 0x88 + lVar72);
            auVar149 = vpmovzxbd_avx(auVar186);
            auVar212._8_8_ = 0;
            auVar212._0_8_ = *(ulong *)(uVar68 + 0x8c + lVar72);
            auVar78 = vpmovzxbd_avx(auVar212);
            auVar192._16_16_ = auVar78;
            auVar192._0_16_ = auVar149;
            auVar14 = vcvtdq2ps_avx(auVar192);
            fVar96 = *(float *)(uVar68 + 0xc4 + lVar72);
            fVar97 = *(float *)(uVar68 + 0xb8 + lVar72);
            auVar193._0_4_ = fVar97 + fVar96 * auVar14._0_4_;
            auVar193._4_4_ = fVar97 + fVar96 * auVar14._4_4_;
            auVar193._8_4_ = fVar97 + fVar96 * auVar14._8_4_;
            auVar193._12_4_ = fVar97 + fVar96 * auVar14._12_4_;
            auVar193._16_4_ = fVar97 + fVar96 * auVar14._16_4_;
            auVar193._20_4_ = fVar97 + fVar96 * auVar14._20_4_;
            auVar193._24_4_ = fVar97 + fVar96 * auVar14._24_4_;
            auVar193._28_4_ = fVar97 + auVar14._28_4_;
            auVar149 = ZEXT416((uint)(((ray->dir).field_0.m128[3] -
                                      *(float *)(uVar68 + 0xd0 + lVar72)) *
                                     *(float *)(uVar68 + 0xd4 + lVar72)));
            auVar149 = vshufps_avx(auVar149,auVar149,0);
            auVar14 = vsubps_avx(auVar193,auVar118);
            fVar98 = auVar149._0_4_;
            fVar99 = auVar149._4_4_;
            fVar100 = auVar149._8_4_;
            fVar144 = auVar149._12_4_;
            auVar119._0_4_ = auVar118._0_4_ + fVar98 * auVar14._0_4_;
            auVar119._4_4_ = auVar118._4_4_ + fVar99 * auVar14._4_4_;
            auVar119._8_4_ = auVar118._8_4_ + fVar100 * auVar14._8_4_;
            auVar119._12_4_ = auVar118._12_4_ + fVar144 * auVar14._12_4_;
            auVar119._16_4_ = auVar118._16_4_ + fVar98 * auVar14._16_4_;
            auVar119._20_4_ = auVar118._20_4_ + fVar99 * auVar14._20_4_;
            auVar119._24_4_ = auVar118._24_4_ + fVar100 * auVar14._24_4_;
            auVar119._28_4_ = auVar118._28_4_ + auVar14._28_4_;
            auVar14 = vcvtdq2ps_avx(auVar150);
            auVar132._0_4_ = fVar95 + fVar160 * auVar14._0_4_;
            auVar132._4_4_ = fVar95 + fVar160 * auVar14._4_4_;
            auVar132._8_4_ = fVar95 + fVar160 * auVar14._8_4_;
            auVar132._12_4_ = fVar95 + fVar160 * auVar14._12_4_;
            auVar132._16_4_ = fVar95 + fVar160 * auVar14._16_4_;
            auVar132._20_4_ = fVar95 + fVar160 * auVar14._20_4_;
            auVar132._24_4_ = fVar95 + fVar160 * auVar14._24_4_;
            auVar132._28_4_ = fVar95 + fVar160;
            auVar145._8_8_ = 0;
            auVar145._0_8_ = *(ulong *)(uVar68 + 0x90 + lVar72);
            auVar149 = vpmovzxbd_avx(auVar145);
            auVar163._8_8_ = 0;
            auVar163._0_8_ = *(ulong *)(uVar68 + 0x94 + lVar72);
            auVar78 = vpmovzxbd_avx(auVar163);
            auVar151._16_16_ = auVar78;
            auVar151._0_16_ = auVar149;
            auVar14 = vcvtdq2ps_avx(auVar151);
            auVar152._0_4_ = fVar97 + fVar96 * auVar14._0_4_;
            auVar152._4_4_ = fVar97 + fVar96 * auVar14._4_4_;
            auVar152._8_4_ = fVar97 + fVar96 * auVar14._8_4_;
            auVar152._12_4_ = fVar97 + fVar96 * auVar14._12_4_;
            auVar152._16_4_ = fVar97 + fVar96 * auVar14._16_4_;
            auVar152._20_4_ = fVar97 + fVar96 * auVar14._20_4_;
            auVar152._24_4_ = fVar97 + fVar96 * auVar14._24_4_;
            auVar152._28_4_ = fVar97 + auVar14._28_4_;
            auVar14 = vsubps_avx(auVar152,auVar132);
            auVar133._0_4_ = auVar132._0_4_ + fVar98 * auVar14._0_4_;
            auVar133._4_4_ = auVar132._4_4_ + fVar99 * auVar14._4_4_;
            auVar133._8_4_ = auVar132._8_4_ + fVar100 * auVar14._8_4_;
            auVar133._12_4_ = auVar132._12_4_ + fVar144 * auVar14._12_4_;
            auVar133._16_4_ = auVar132._16_4_ + fVar98 * auVar14._16_4_;
            auVar133._20_4_ = auVar132._20_4_ + fVar99 * auVar14._20_4_;
            auVar133._24_4_ = auVar132._24_4_ + fVar100 * auVar14._24_4_;
            auVar133._28_4_ = auVar132._28_4_ + auVar14._28_4_;
            auVar146._8_8_ = 0;
            auVar146._0_8_ = *(ulong *)(uVar68 + 0x50 + lVar72);
            auVar149 = vpmovzxbd_avx(auVar146);
            auVar164._8_8_ = 0;
            auVar164._0_8_ = *(ulong *)(uVar68 + 0x54 + lVar72);
            auVar78 = vpmovzxbd_avx(auVar164);
            auVar153._16_16_ = auVar78;
            auVar153._0_16_ = auVar149;
            fVar160 = *(float *)(uVar68 + 0x80 + lVar72);
            auVar14 = vcvtdq2ps_avx(auVar153);
            fVar95 = *(float *)(uVar68 + 0x74 + lVar72);
            auVar154._0_4_ = fVar95 + fVar160 * auVar14._0_4_;
            auVar154._4_4_ = fVar95 + fVar160 * auVar14._4_4_;
            auVar154._8_4_ = fVar95 + fVar160 * auVar14._8_4_;
            auVar154._12_4_ = fVar95 + fVar160 * auVar14._12_4_;
            auVar154._16_4_ = fVar95 + fVar160 * auVar14._16_4_;
            auVar154._20_4_ = fVar95 + fVar160 * auVar14._20_4_;
            auVar154._24_4_ = fVar95 + fVar160 * auVar14._24_4_;
            auVar154._28_4_ = fVar95 + auVar14._28_4_;
            auVar213._8_8_ = 0;
            auVar213._0_8_ = *(ulong *)(uVar68 + 0x98 + lVar72);
            auVar149 = vpmovzxbd_avx(auVar213);
            auVar232._8_8_ = 0;
            auVar232._0_8_ = *(ulong *)(uVar68 + 0x9c + lVar72);
            auVar78 = vpmovzxbd_avx(auVar232);
            auVar217._16_16_ = auVar78;
            auVar217._0_16_ = auVar149;
            fVar96 = *(float *)(uVar68 + 200 + lVar72);
            auVar14 = vcvtdq2ps_avx(auVar217);
            fVar97 = *(float *)(uVar68 + 0xbc + lVar72);
            auVar218._0_4_ = fVar97 + fVar96 * auVar14._0_4_;
            auVar218._4_4_ = fVar97 + fVar96 * auVar14._4_4_;
            auVar218._8_4_ = fVar97 + fVar96 * auVar14._8_4_;
            auVar218._12_4_ = fVar97 + fVar96 * auVar14._12_4_;
            auVar218._16_4_ = fVar97 + fVar96 * auVar14._16_4_;
            auVar218._20_4_ = fVar97 + fVar96 * auVar14._20_4_;
            auVar218._24_4_ = fVar97 + fVar96 * auVar14._24_4_;
            auVar218._28_4_ = fVar97 + auVar14._28_4_;
            auVar14 = vsubps_avx(auVar218,auVar154);
            auVar155._0_4_ = auVar14._0_4_ * fVar98 + auVar154._0_4_;
            auVar155._4_4_ = auVar14._4_4_ * fVar99 + auVar154._4_4_;
            auVar155._8_4_ = auVar14._8_4_ * fVar100 + auVar154._8_4_;
            auVar155._12_4_ = auVar14._12_4_ * fVar144 + auVar154._12_4_;
            auVar155._16_4_ = auVar14._16_4_ * fVar98 + auVar154._16_4_;
            auVar155._20_4_ = auVar14._20_4_ * fVar99 + auVar154._20_4_;
            auVar155._24_4_ = auVar14._24_4_ * fVar100 + auVar154._24_4_;
            auVar155._28_4_ = auVar14._28_4_ + auVar154._28_4_;
            auVar214._8_8_ = 0;
            auVar214._0_8_ = *(ulong *)(uVar68 + 0x58 + lVar72);
            auVar149 = vpmovzxbd_avx(auVar214);
            auVar267._8_8_ = 0;
            auVar267._0_8_ = *(ulong *)(uVar68 + 0x5c + lVar72);
            auVar78 = vpmovzxbd_avx(auVar267);
            auVar219._16_16_ = auVar78;
            auVar219._0_16_ = auVar149;
            auVar14 = vcvtdq2ps_avx(auVar219);
            auVar168._0_4_ = fVar95 + auVar14._0_4_ * fVar160;
            auVar168._4_4_ = fVar95 + auVar14._4_4_ * fVar160;
            auVar168._8_4_ = fVar95 + auVar14._8_4_ * fVar160;
            auVar168._12_4_ = fVar95 + auVar14._12_4_ * fVar160;
            auVar168._16_4_ = fVar95 + auVar14._16_4_ * fVar160;
            auVar168._20_4_ = fVar95 + auVar14._20_4_ * fVar160;
            auVar168._24_4_ = fVar95 + auVar14._24_4_ * fVar160;
            auVar168._28_4_ = fVar95 + fVar160;
            auVar187._8_8_ = 0;
            auVar187._0_8_ = *(ulong *)(uVar68 + 0xa0 + lVar72);
            auVar149 = vpmovzxbd_avx(auVar187);
            auVar215._8_8_ = 0;
            auVar215._0_8_ = *(ulong *)(uVar68 + 0xa4 + lVar72);
            auVar78 = vpmovzxbd_avx(auVar215);
            auVar194._16_16_ = auVar78;
            auVar194._0_16_ = auVar149;
            auVar14 = vcvtdq2ps_avx(auVar194);
            auVar195._0_4_ = fVar97 + fVar96 * auVar14._0_4_;
            auVar195._4_4_ = fVar97 + fVar96 * auVar14._4_4_;
            auVar195._8_4_ = fVar97 + fVar96 * auVar14._8_4_;
            auVar195._12_4_ = fVar97 + fVar96 * auVar14._12_4_;
            auVar195._16_4_ = fVar97 + fVar96 * auVar14._16_4_;
            auVar195._20_4_ = fVar97 + fVar96 * auVar14._20_4_;
            auVar195._24_4_ = fVar97 + fVar96 * auVar14._24_4_;
            auVar195._28_4_ = fVar97 + auVar14._28_4_;
            auVar14 = vsubps_avx(auVar195,auVar168);
            auVar169._0_4_ = auVar168._0_4_ + fVar98 * auVar14._0_4_;
            auVar169._4_4_ = auVar168._4_4_ + fVar99 * auVar14._4_4_;
            auVar169._8_4_ = auVar168._8_4_ + fVar100 * auVar14._8_4_;
            auVar169._12_4_ = auVar168._12_4_ + fVar144 * auVar14._12_4_;
            auVar169._16_4_ = auVar168._16_4_ + fVar98 * auVar14._16_4_;
            auVar169._20_4_ = auVar168._20_4_ + fVar99 * auVar14._20_4_;
            auVar169._24_4_ = auVar168._24_4_ + fVar100 * auVar14._24_4_;
            auVar169._28_4_ = auVar168._28_4_ + auVar14._28_4_;
            auVar188._8_8_ = 0;
            auVar188._0_8_ = *(ulong *)(uVar68 + 0x60 + lVar72);
            auVar149 = vpmovzxbd_avx(auVar188);
            auVar216._8_8_ = 0;
            auVar216._0_8_ = *(ulong *)(uVar68 + 100 + lVar72);
            auVar78 = vpmovzxbd_avx(auVar216);
            auVar196._16_16_ = auVar78;
            auVar196._0_16_ = auVar149;
            fVar160 = *(float *)(uVar68 + 0x84 + lVar72);
            fVar95 = *(float *)(uVar68 + 0x78 + lVar72);
            auVar14 = vcvtdq2ps_avx(auVar196);
            auVar197._0_4_ = fVar95 + fVar160 * auVar14._0_4_;
            auVar197._4_4_ = fVar95 + fVar160 * auVar14._4_4_;
            auVar197._8_4_ = fVar95 + fVar160 * auVar14._8_4_;
            auVar197._12_4_ = fVar95 + fVar160 * auVar14._12_4_;
            auVar197._16_4_ = fVar95 + fVar160 * auVar14._16_4_;
            auVar197._20_4_ = fVar95 + fVar160 * auVar14._20_4_;
            auVar197._24_4_ = fVar95 + fVar160 * auVar14._24_4_;
            auVar197._28_4_ = fVar95 + auVar14._28_4_;
            auVar248._8_8_ = 0;
            auVar248._0_8_ = *(ulong *)(uVar68 + 0xa8 + lVar72);
            auVar149 = vpmovzxbd_avx(auVar248);
            auVar268._8_8_ = 0;
            auVar268._0_8_ = *(ulong *)(uVar68 + 0xac + lVar72);
            auVar78 = vpmovzxbd_avx(auVar268);
            auVar251._16_16_ = auVar78;
            auVar251._0_16_ = auVar149;
            fVar96 = *(float *)(uVar68 + 0xcc + lVar72);
            fVar97 = *(float *)(uVar68 + 0xc0 + lVar72);
            auVar14 = vcvtdq2ps_avx(auVar251);
            auVar252._0_4_ = fVar97 + fVar96 * auVar14._0_4_;
            auVar252._4_4_ = fVar97 + fVar96 * auVar14._4_4_;
            auVar252._8_4_ = fVar97 + fVar96 * auVar14._8_4_;
            auVar252._12_4_ = fVar97 + fVar96 * auVar14._12_4_;
            auVar252._16_4_ = fVar97 + fVar96 * auVar14._16_4_;
            auVar252._20_4_ = fVar97 + fVar96 * auVar14._20_4_;
            auVar252._24_4_ = fVar97 + fVar96 * auVar14._24_4_;
            auVar252._28_4_ = fVar97 + auVar14._28_4_;
            auVar14 = vsubps_avx(auVar252,auVar197);
            auVar198._0_4_ = auVar14._0_4_ * fVar98 + auVar197._0_4_;
            auVar198._4_4_ = auVar14._4_4_ * fVar99 + auVar197._4_4_;
            auVar198._8_4_ = auVar14._8_4_ * fVar100 + auVar197._8_4_;
            auVar198._12_4_ = auVar14._12_4_ * fVar144 + auVar197._12_4_;
            auVar198._16_4_ = auVar14._16_4_ * fVar98 + auVar197._16_4_;
            auVar198._20_4_ = auVar14._20_4_ * fVar99 + auVar197._20_4_;
            auVar198._24_4_ = auVar14._24_4_ * fVar100 + auVar197._24_4_;
            auVar198._28_4_ = auVar14._28_4_ + auVar197._28_4_;
            auVar249._8_8_ = 0;
            auVar249._0_8_ = *(ulong *)(uVar68 + 0x68 + lVar72);
            auVar149 = vpmovzxbd_avx(auVar249);
            auVar282._8_8_ = 0;
            auVar282._0_8_ = *(ulong *)(uVar68 + 0x6c + lVar72);
            auVar78 = vpmovzxbd_avx(auVar282);
            auVar253._16_16_ = auVar78;
            auVar253._0_16_ = auVar149;
            auVar14 = vcvtdq2ps_avx(auVar253);
            auVar220._0_4_ = fVar95 + fVar160 * auVar14._0_4_;
            auVar220._4_4_ = fVar95 + fVar160 * auVar14._4_4_;
            auVar220._8_4_ = fVar95 + fVar160 * auVar14._8_4_;
            auVar220._12_4_ = fVar95 + fVar160 * auVar14._12_4_;
            auVar220._16_4_ = fVar95 + fVar160 * auVar14._16_4_;
            auVar220._20_4_ = fVar95 + fVar160 * auVar14._20_4_;
            auVar220._24_4_ = fVar95 + fVar160 * auVar14._24_4_;
            auVar220._28_4_ = fVar95 + fVar160;
            auVar233._8_8_ = 0;
            auVar233._0_8_ = *(ulong *)(uVar68 + 0xb0 + lVar72);
            auVar149 = vpmovzxbd_avx(auVar233);
            auVar250._8_8_ = 0;
            auVar250._0_8_ = *(ulong *)(uVar68 + 0xb4 + lVar72);
            auVar78 = vpmovzxbd_avx(auVar250);
            auVar234._16_16_ = auVar78;
            auVar234._0_16_ = auVar149;
            auVar14 = vcvtdq2ps_avx(auVar234);
            auVar235._0_4_ = fVar97 + fVar96 * auVar14._0_4_;
            auVar235._4_4_ = fVar97 + fVar96 * auVar14._4_4_;
            auVar235._8_4_ = fVar97 + fVar96 * auVar14._8_4_;
            auVar235._12_4_ = fVar97 + fVar96 * auVar14._12_4_;
            auVar235._16_4_ = fVar97 + fVar96 * auVar14._16_4_;
            auVar235._20_4_ = fVar97 + fVar96 * auVar14._20_4_;
            auVar235._24_4_ = fVar97 + fVar96 * auVar14._24_4_;
            auVar235._28_4_ = fVar97 + auVar14._28_4_;
            auVar14 = vsubps_avx(auVar235,auVar220);
            auVar221._0_4_ = auVar220._0_4_ + auVar14._0_4_ * fVar98;
            auVar221._4_4_ = auVar220._4_4_ + auVar14._4_4_ * fVar99;
            auVar221._8_4_ = auVar220._8_4_ + auVar14._8_4_ * fVar100;
            auVar221._12_4_ = auVar220._12_4_ + auVar14._12_4_ * fVar144;
            auVar221._16_4_ = auVar220._16_4_ + auVar14._16_4_ * fVar98;
            auVar221._20_4_ = auVar220._20_4_ + auVar14._20_4_ * fVar99;
            auVar221._24_4_ = auVar220._24_4_ + auVar14._24_4_ * fVar100;
            auVar221._28_4_ = auVar220._28_4_ + fVar144;
            auVar14 = vsubps_avx(auVar119,auVar303._0_32_);
            auVar102._0_4_ = auVar14._0_4_ * (float)local_1560._0_4_;
            auVar102._4_4_ = auVar14._4_4_ * (float)local_1560._4_4_;
            auVar102._8_4_ = auVar14._8_4_ * fStack_1558;
            auVar102._12_4_ = auVar14._12_4_ * fStack_1554;
            auVar19._16_4_ = auVar14._16_4_ * fStack_1550;
            auVar19._0_16_ = auVar102;
            auVar19._20_4_ = auVar14._20_4_ * fStack_154c;
            auVar19._24_4_ = auVar14._24_4_ * fStack_1548;
            auVar19._28_4_ = auVar14._28_4_;
            auVar14 = vsubps_avx(auVar155,local_15c0);
            auVar114._0_4_ = auVar14._0_4_ * (float)local_1580._0_4_;
            auVar114._4_4_ = auVar14._4_4_ * (float)local_1580._4_4_;
            auVar114._8_4_ = auVar14._8_4_ * fStack_1578;
            auVar114._12_4_ = auVar14._12_4_ * fStack_1574;
            auVar20._16_4_ = auVar14._16_4_ * fStack_1570;
            auVar20._0_16_ = auVar114;
            auVar20._20_4_ = auVar14._20_4_ * fStack_156c;
            auVar20._24_4_ = auVar14._24_4_ * fStack_1568;
            auVar20._28_4_ = auVar14._28_4_;
            auVar14 = vsubps_avx(auVar198,auVar172._0_32_);
            auVar147._0_4_ = auVar14._0_4_ * (float)local_15a0._0_4_;
            auVar147._4_4_ = auVar14._4_4_ * (float)local_15a0._4_4_;
            auVar147._8_4_ = auVar14._8_4_ * fStack_1598;
            auVar147._12_4_ = auVar14._12_4_ * fStack_1594;
            auVar21._16_4_ = auVar14._16_4_ * fStack_1590;
            auVar21._0_16_ = auVar147;
            auVar21._20_4_ = auVar14._20_4_ * fStack_158c;
            auVar21._24_4_ = auVar14._24_4_ * fStack_1588;
            auVar21._28_4_ = auVar14._28_4_;
            auVar14 = vsubps_avx(auVar133,auVar303._0_32_);
            auVar128._0_4_ = auVar254._0_4_ * auVar14._0_4_;
            auVar128._4_4_ = auVar254._4_4_ * auVar14._4_4_;
            auVar128._8_4_ = auVar254._8_4_ * auVar14._8_4_;
            auVar128._12_4_ = auVar254._12_4_ * auVar14._12_4_;
            auVar22._16_4_ = auVar254._16_4_ * auVar14._16_4_;
            auVar22._0_16_ = auVar128;
            auVar22._20_4_ = auVar254._20_4_ * auVar14._20_4_;
            auVar22._24_4_ = auVar254._24_4_ * auVar14._24_4_;
            auVar22._28_4_ = auVar14._28_4_;
            auVar137 = ZEXT3264(auVar22);
            auVar14 = vsubps_avx(auVar169,local_15c0);
            auVar165._0_4_ = auVar271._0_4_ * auVar14._0_4_;
            auVar165._4_4_ = auVar271._4_4_ * auVar14._4_4_;
            auVar165._8_4_ = auVar271._8_4_ * auVar14._8_4_;
            auVar165._12_4_ = auVar271._12_4_ * auVar14._12_4_;
            auVar23._16_4_ = auVar271._16_4_ * auVar14._16_4_;
            auVar23._0_16_ = auVar165;
            auVar23._20_4_ = auVar271._20_4_ * auVar14._20_4_;
            auVar23._24_4_ = auVar271._24_4_ * auVar14._24_4_;
            auVar23._28_4_ = auVar14._28_4_;
            auVar14 = vsubps_avx(auVar221,auVar172._0_32_);
            auVar189._0_4_ = local_15e0._0_4_ * auVar14._0_4_;
            auVar189._4_4_ = local_15e0._4_4_ * auVar14._4_4_;
            auVar189._8_4_ = local_15e0._8_4_ * auVar14._8_4_;
            auVar189._12_4_ = local_15e0._12_4_ * auVar14._12_4_;
            auVar24._16_4_ = local_15e0._16_4_ * auVar14._16_4_;
            auVar24._0_16_ = auVar189;
            auVar24._20_4_ = local_15e0._20_4_ * auVar14._20_4_;
            auVar24._24_4_ = local_15e0._24_4_ * auVar14._24_4_;
            auVar24._28_4_ = auVar14._28_4_;
            auVar78 = vpminsd_avx(auVar19._16_16_,auVar22._16_16_);
            auVar149 = vpmaxsd_avx(auVar19._16_16_,auVar22._16_16_);
            auVar127 = vpminsd_avx(auVar20._16_16_,auVar23._16_16_);
            auVar78 = vpmaxsd_avx(auVar78,auVar127);
            auVar127 = vpmaxsd_avx(auVar20._16_16_,auVar23._16_16_);
            auVar101 = vpminsd_avx(auVar149,auVar127);
            auVar127 = vpminsd_avx(auVar21._16_16_,auVar24._16_16_);
            auVar149 = vpmaxsd_avx(auVar21._16_16_,auVar24._16_16_);
            auVar127 = vpmaxsd_avx(auVar127,local_1440._0_16_);
            auVar78 = vpmaxsd_avx(auVar78,auVar127);
            auVar149 = vpminsd_avx(auVar149,local_1460._0_16_);
            auVar127 = vpminsd_avx(auVar101,auVar149);
            auVar149 = vpcmpeqd_avx(auVar271._0_16_,auVar271._0_16_);
            auVar101 = vpmovsxbd_avx(auVar149 ^ auVar77);
            auVar77 = vpcmpgtd_avx(auVar78,auVar127);
            auVar101 = vpor_avx(auVar77,auVar101);
            auVar77 = vpminsd_avx(auVar102,auVar128);
            auVar78 = vpminsd_avx(auVar114,auVar165);
            auVar77 = vpmaxsd_avx(auVar77,auVar78);
            auVar78 = vpminsd_avx(auVar147,auVar189);
            auVar78 = vpmaxsd_avx(auVar78,local_1600._0_16_);
            auVar77 = vpmaxsd_avx(auVar77,auVar78);
            auVar78 = vpmaxsd_avx(auVar102,auVar128);
            auVar127 = vpmaxsd_avx(auVar114,auVar165);
            auVar127 = vpminsd_avx(auVar78,auVar127);
            auVar78 = vpmaxsd_avx(auVar147,auVar189);
            auVar78 = vpminsd_avx(auVar78,local_1620._0_16_);
            auVar123 = ZEXT1664(auVar78);
            auVar78 = vpminsd_avx(auVar127,auVar78);
            auVar77 = vpcmpgtd_avx(auVar77,auVar78);
            auVar107 = ZEXT1664(auVar77);
            auVar149 = vpmovsxbd_avx(auVar149 ^ local_17f0);
            auVar77 = vpor_avx(auVar77,auVar149);
            auVar83._16_16_ = auVar101;
            auVar83._0_16_ = auVar77;
            auVar14 = vcvtdq2ps_avx(auVar83);
            auVar91._8_4_ = 0xbf800000;
            auVar91._0_8_ = 0xbf800000bf800000;
            auVar91._12_4_ = 0xbf800000;
            auVar91._16_4_ = 0xbf800000;
            auVar91._20_4_ = 0xbf800000;
            auVar91._24_4_ = 0xbf800000;
            auVar91._28_4_ = 0xbf800000;
            auVar94 = ZEXT3264(auVar91);
            auVar14 = vcmpps_avx(auVar91,auVar14,1);
            uVar71 = vmovmskps_avx(auVar14);
            if (uVar71 != 0) {
              local_1720 = (ulong)(uVar71 & 0xff);
              local_1740 = lVar72 + uVar68;
              do {
                lVar72 = 0;
                if (local_1720 != 0) {
                  for (; (local_1720 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                  }
                }
                uVar6 = *(ushort *)(local_1740 + lVar72 * 8);
                uVar7 = *(ushort *)(local_1740 + 2 + lVar72 * 8);
                uVar73 = CONCAT44(0,*(uint *)(local_1740 + 0xd8));
                local_1748 = (ulong)*(uint *)(local_1740 + 4 + lVar72 * 8);
                local_1708 = context->scene;
                local_17f0._0_8_ = uVar73;
                pGVar65 = (local_1708->geometries).items[uVar73].ptr;
                local_1710 = *(long *)&pGVar65->field_0x58;
                local_1718 = pGVar65[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * local_1748;
                fVar160 = (pGVar65->time_range).lower;
                fVar160 = pGVar65->fnumTimeSegments *
                          (((ray->dir).field_0.m128[3] - fVar160) /
                          ((pGVar65->time_range).upper - fVar160));
                auVar77 = vroundss_avx(ZEXT416((uint)fVar160),ZEXT416((uint)fVar160),9);
                auVar77 = vminss_avx(auVar77,ZEXT416((uint)(pGVar65->fnumTimeSegments + -1.0)));
                auVar80 = vmaxss_avx(ZEXT816(0) << 0x20,auVar77);
                local_1828 = uVar6 & 0x7fff;
                local_182c = uVar7 & 0x7fff;
                uVar71 = *(uint *)(local_1710 + 4 + local_1718);
                uVar62 = (ulong)uVar71;
                uVar60 = (ulong)(uVar71 * local_182c +
                                *(int *)(local_1710 + local_1718) + local_1828);
                lVar8 = *(long *)&pGVar65[2].numPrimitives;
                lVar63 = (long)(int)auVar80._0_4_ * 0x38;
                lVar9 = *(long *)(lVar8 + 0x10 + lVar63);
                lVar10 = *(long *)(lVar8 + lVar63);
                auVar77 = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar60);
                lVar11 = *(long *)(lVar8 + 0x48 + lVar63);
                auVar149 = *(undefined1 (*) [16])(lVar10 + (uVar60 + 1) * lVar9);
                lVar72 = uVar60 + uVar62;
                auVar78 = *(undefined1 (*) [16])(lVar10 + lVar72 * lVar9);
                lVar66 = uVar60 + uVar62 + 1;
                auVar127 = *(undefined1 (*) [16])(lVar10 + lVar66 * lVar9);
                uVar70 = (ulong)(-1 < (short)uVar6);
                lVar61 = uVar60 + uVar70 + 1;
                auVar101 = *(undefined1 (*) [16])(lVar10 + lVar61 * lVar9);
                lVar64 = uVar70 + lVar66;
                auVar111 = *(undefined1 (*) [16])(lVar10 + lVar64 * lVar9);
                uVar70 = 0;
                if (-1 < (short)uVar7) {
                  uVar70 = uVar62;
                }
                auVar79 = *(undefined1 (*) [16])(lVar10 + (lVar72 + uVar70) * lVar9);
                auVar88 = *(undefined1 (*) [16])(lVar10 + (lVar66 + uVar70) * lVar9);
                auVar102 = *(undefined1 (*) [16])(lVar10 + lVar9 * (uVar70 + lVar64));
                lVar8 = *(long *)(lVar8 + 0x38 + lVar63);
                auVar80 = ZEXT416((uint)(fVar160 - auVar80._0_4_));
                auVar80 = vshufps_avx(auVar80,auVar80,0);
                auVar112 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * uVar60),auVar77);
                fVar160 = auVar80._0_4_;
                fVar95 = auVar80._4_4_;
                fVar96 = auVar80._8_4_;
                fVar97 = auVar80._12_4_;
                auVar269._0_4_ = auVar112._0_4_ * fVar160 + auVar77._0_4_;
                auVar269._4_4_ = auVar112._4_4_ * fVar95 + auVar77._4_4_;
                auVar269._8_4_ = auVar112._8_4_ * fVar96 + auVar77._8_4_;
                auVar269._12_4_ = auVar112._12_4_ * fVar97 + auVar77._12_4_;
                auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * (uVar60 + 1)),auVar149)
                ;
                auVar103._0_4_ = auVar77._0_4_ * fVar160 + auVar149._0_4_;
                auVar103._4_4_ = auVar77._4_4_ * fVar95 + auVar149._4_4_;
                auVar103._8_4_ = auVar77._8_4_ * fVar96 + auVar149._8_4_;
                auVar103._12_4_ = auVar77._12_4_ * fVar97 + auVar149._12_4_;
                auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar72),auVar78);
                auVar129._0_4_ = auVar77._0_4_ * fVar160 + auVar78._0_4_;
                auVar129._4_4_ = auVar77._4_4_ * fVar95 + auVar78._4_4_;
                auVar129._8_4_ = auVar77._8_4_ * fVar96 + auVar78._8_4_;
                auVar129._12_4_ = auVar77._12_4_ * fVar97 + auVar78._12_4_;
                auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar66),auVar127);
                auVar89._0_4_ = auVar77._0_4_ * fVar160 + auVar127._0_4_;
                auVar89._4_4_ = auVar77._4_4_ * fVar95 + auVar127._4_4_;
                auVar89._8_4_ = auVar77._8_4_ * fVar96 + auVar127._8_4_;
                auVar89._12_4_ = auVar77._12_4_ * fVar97 + auVar127._12_4_;
                auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar61),auVar101);
                auVar166._0_4_ = auVar77._0_4_ * fVar160 + auVar101._0_4_;
                auVar166._4_4_ = auVar77._4_4_ * fVar95 + auVar101._4_4_;
                auVar166._8_4_ = auVar77._8_4_ * fVar96 + auVar101._8_4_;
                auVar166._12_4_ = auVar77._12_4_ * fVar97 + auVar101._12_4_;
                auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar64),auVar111);
                auVar148._0_4_ = auVar111._0_4_ + fVar160 * auVar77._0_4_;
                auVar148._4_4_ = auVar111._4_4_ + fVar95 * auVar77._4_4_;
                auVar148._8_4_ = auVar111._8_4_ + fVar96 * auVar77._8_4_;
                auVar148._12_4_ = auVar111._12_4_ + fVar97 * auVar77._12_4_;
                auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * (lVar72 + uVar70)),
                                     auVar79);
                auVar115._0_4_ = auVar79._0_4_ + fVar160 * auVar77._0_4_;
                auVar115._4_4_ = auVar79._4_4_ + fVar95 * auVar77._4_4_;
                auVar115._8_4_ = auVar79._8_4_ + fVar96 * auVar77._8_4_;
                auVar115._12_4_ = auVar79._12_4_ + fVar97 * auVar77._12_4_;
                auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * (lVar66 + uVar70)),
                                     auVar88);
                auVar190._0_4_ = auVar88._0_4_ + fVar160 * auVar77._0_4_;
                auVar190._4_4_ = auVar88._4_4_ + fVar95 * auVar77._4_4_;
                auVar190._8_4_ = auVar88._8_4_ + fVar96 * auVar77._8_4_;
                auVar190._12_4_ = auVar88._12_4_ + fVar97 * auVar77._12_4_;
                auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + (uVar70 + lVar64) * lVar11),
                                     auVar102);
                auVar81._0_4_ = auVar102._0_4_ + auVar77._0_4_ * fVar160;
                auVar81._4_4_ = auVar102._4_4_ + auVar77._4_4_ * fVar95;
                auVar81._8_4_ = auVar102._8_4_ + auVar77._8_4_ * fVar96;
                auVar81._12_4_ = auVar102._12_4_ + auVar77._12_4_ * fVar97;
                auVar78 = vunpcklps_avx(auVar269,auVar89);
                auVar77 = vunpckhps_avx(auVar269,auVar89);
                auVar127 = vunpcklps_avx(auVar103,auVar129);
                auVar149 = vunpckhps_avx(auVar103,auVar129);
                auVar111 = vunpcklps_avx(auVar77,auVar149);
                auVar80 = vunpcklps_avx(auVar78,auVar127);
                auVar77 = vunpckhps_avx(auVar78,auVar127);
                auVar127 = vunpcklps_avx(auVar103,auVar148);
                auVar149 = vunpckhps_avx(auVar103,auVar148);
                auVar101 = vunpcklps_avx(auVar166,auVar89);
                auVar78 = vunpckhps_avx(auVar166,auVar89);
                auVar79 = vunpcklps_avx(auVar149,auVar78);
                auVar88 = vunpcklps_avx(auVar127,auVar101);
                auVar149 = vunpckhps_avx(auVar127,auVar101);
                auVar101 = vunpcklps_avx(auVar89,auVar81);
                auVar78 = vunpckhps_avx(auVar89,auVar81);
                auVar102 = vunpcklps_avx(auVar148,auVar190);
                auVar127 = vunpckhps_avx(auVar148,auVar190);
                auVar112 = vunpcklps_avx(auVar78,auVar127);
                auVar113 = vunpcklps_avx(auVar101,auVar102);
                auVar78 = vunpckhps_avx(auVar101,auVar102);
                auVar102 = vunpcklps_avx(auVar129,auVar190);
                auVar127 = vunpckhps_avx(auVar129,auVar190);
                auVar114 = vunpcklps_avx(auVar89,auVar115);
                auVar101 = vunpckhps_avx(auVar89,auVar115);
                auVar101 = vunpcklps_avx(auVar127,auVar101);
                auVar128 = vunpcklps_avx(auVar102,auVar114);
                auVar127 = vunpckhps_avx(auVar102,auVar114);
                auVar156._16_16_ = auVar113;
                auVar156._0_16_ = auVar80;
                auVar199._16_16_ = auVar78;
                auVar199._0_16_ = auVar77;
                auVar84._16_16_ = auVar112;
                auVar84._0_16_ = auVar111;
                auVar170._16_16_ = auVar88;
                auVar170._0_16_ = auVar88;
                auVar222._16_16_ = auVar149;
                auVar222._0_16_ = auVar149;
                auVar236._16_16_ = auVar79;
                auVar236._0_16_ = auVar79;
                auVar120._16_16_ = auVar128;
                auVar120._0_16_ = auVar128;
                auVar302._16_16_ = auVar127;
                auVar302._0_16_ = auVar127;
                auVar270._16_16_ = auVar101;
                auVar270._0_16_ = auVar101;
                uVar3 = *(undefined4 *)&(local_1838->org).field_0;
                auVar134._4_4_ = uVar3;
                auVar134._0_4_ = uVar3;
                auVar134._8_4_ = uVar3;
                auVar134._12_4_ = uVar3;
                auVar134._16_4_ = uVar3;
                auVar134._20_4_ = uVar3;
                auVar134._24_4_ = uVar3;
                auVar134._28_4_ = uVar3;
                uVar3 = *(undefined4 *)((long)&(local_1838->org).field_0 + 4);
                auVar274._4_4_ = uVar3;
                auVar274._0_4_ = uVar3;
                auVar274._8_4_ = uVar3;
                auVar274._12_4_ = uVar3;
                auVar274._16_4_ = uVar3;
                auVar274._20_4_ = uVar3;
                auVar274._24_4_ = uVar3;
                auVar274._28_4_ = uVar3;
                uVar3 = *(undefined4 *)((long)&(local_1838->org).field_0 + 8);
                auVar283._4_4_ = uVar3;
                auVar283._0_4_ = uVar3;
                auVar283._8_4_ = uVar3;
                auVar283._12_4_ = uVar3;
                auVar283._16_4_ = uVar3;
                auVar283._20_4_ = uVar3;
                auVar283._24_4_ = uVar3;
                auVar283._28_4_ = uVar3;
                local_16a0 = vsubps_avx(auVar156,auVar134);
                local_1640 = vsubps_avx(auVar199,auVar274);
                local_1660 = vsubps_avx(auVar84,auVar283);
                auVar14 = vsubps_avx(auVar170,auVar134);
                auVar12 = vsubps_avx(auVar222,auVar274);
                auVar13 = vsubps_avx(auVar236,auVar283);
                auVar15 = vsubps_avx(auVar120,auVar134);
                auVar16 = vsubps_avx(auVar302,auVar274);
                auVar17 = vsubps_avx(auVar270,auVar283);
                local_1680 = vsubps_avx(auVar15,local_16a0);
                local_1380 = vsubps_avx(auVar16,local_1640);
                local_13a0 = vsubps_avx(auVar17,local_1660);
                fVar95 = local_1640._0_4_;
                fVar160 = auVar16._0_4_ + fVar95;
                fVar96 = local_1640._4_4_;
                fVar173 = auVar16._4_4_ + fVar96;
                fVar97 = local_1640._8_4_;
                fVar175 = auVar16._8_4_ + fVar97;
                fVar98 = local_1640._12_4_;
                fVar177 = auVar16._12_4_ + fVar98;
                fVar99 = local_1640._16_4_;
                fVar179 = auVar16._16_4_ + fVar99;
                fVar100 = local_1640._20_4_;
                fVar181 = auVar16._20_4_ + fVar100;
                fVar144 = local_1640._24_4_;
                fVar183 = auVar16._24_4_ + fVar144;
                fVar126 = local_1640._28_4_;
                fVar285 = local_1660._0_4_;
                fVar185 = fVar285 + auVar17._0_4_;
                fVar288 = local_1660._4_4_;
                fVar203 = fVar288 + auVar17._4_4_;
                fVar290 = local_1660._8_4_;
                fVar204 = fVar290 + auVar17._8_4_;
                fVar292 = local_1660._12_4_;
                fVar205 = fVar292 + auVar17._12_4_;
                fVar294 = local_1660._16_4_;
                fVar206 = fVar294 + auVar17._16_4_;
                fVar296 = local_1660._20_4_;
                fVar207 = fVar296 + auVar17._20_4_;
                fVar298 = local_1660._24_4_;
                fVar209 = fVar298 + auVar17._24_4_;
                fVar138 = local_1660._28_4_;
                fVar108 = local_13a0._0_4_;
                fVar109 = local_13a0._4_4_;
                auVar25._4_4_ = fVar109 * fVar173;
                auVar25._0_4_ = fVar108 * fVar160;
                fVar110 = local_13a0._8_4_;
                auVar25._8_4_ = fVar110 * fVar175;
                fVar86 = local_13a0._12_4_;
                auVar25._12_4_ = fVar86 * fVar177;
                fVar87 = local_13a0._16_4_;
                auVar25._16_4_ = fVar87 * fVar179;
                fVar124 = local_13a0._20_4_;
                auVar25._20_4_ = fVar124 * fVar181;
                fVar125 = local_13a0._24_4_;
                auVar25._24_4_ = fVar125 * fVar183;
                auVar25._28_4_ = auVar79._12_4_;
                fVar300 = local_1380._0_4_;
                fVar304 = local_1380._4_4_;
                auVar26._4_4_ = fVar304 * fVar203;
                auVar26._0_4_ = fVar300 * fVar185;
                fVar306 = local_1380._8_4_;
                auVar26._8_4_ = fVar306 * fVar204;
                fVar308 = local_1380._12_4_;
                auVar26._12_4_ = fVar308 * fVar205;
                fVar310 = local_1380._16_4_;
                auVar26._16_4_ = fVar310 * fVar206;
                fVar312 = local_1380._20_4_;
                auVar26._20_4_ = fVar312 * fVar207;
                fVar314 = local_1380._24_4_;
                auVar26._24_4_ = fVar314 * fVar209;
                auVar26._28_4_ = auVar101._12_4_;
                auVar82 = vsubps_avx(auVar26,auVar25);
                fVar246 = local_16a0._0_4_;
                fVar231 = fVar246 + auVar15._0_4_;
                fVar255 = local_16a0._4_4_;
                fVar239 = fVar255 + auVar15._4_4_;
                fVar257 = local_16a0._8_4_;
                fVar240 = fVar257 + auVar15._8_4_;
                fVar259 = local_16a0._12_4_;
                fVar241 = fVar259 + auVar15._12_4_;
                fVar261 = local_16a0._16_4_;
                fVar242 = fVar261 + auVar15._16_4_;
                fVar263 = local_16a0._20_4_;
                fVar243 = fVar263 + auVar15._20_4_;
                fVar265 = local_16a0._24_4_;
                fVar244 = fVar265 + auVar15._24_4_;
                fVar245 = local_16a0._28_4_ + auVar15._28_4_;
                fVar272 = local_1680._0_4_;
                fVar276 = local_1680._4_4_;
                auVar27._4_4_ = fVar276 * fVar203;
                auVar27._0_4_ = fVar272 * fVar185;
                fVar277 = local_1680._8_4_;
                auVar27._8_4_ = fVar277 * fVar204;
                fVar278 = local_1680._12_4_;
                auVar27._12_4_ = fVar278 * fVar205;
                fVar279 = local_1680._16_4_;
                auVar27._16_4_ = fVar279 * fVar206;
                fVar280 = local_1680._20_4_;
                auVar27._20_4_ = fVar280 * fVar207;
                fVar281 = local_1680._24_4_;
                auVar27._24_4_ = fVar281 * fVar209;
                auVar27._28_4_ = fVar138 + auVar17._28_4_;
                auVar28._4_4_ = fVar239 * fVar109;
                auVar28._0_4_ = fVar231 * fVar108;
                auVar28._8_4_ = fVar240 * fVar110;
                auVar28._12_4_ = fVar241 * fVar86;
                auVar28._16_4_ = fVar242 * fVar87;
                auVar28._20_4_ = fVar243 * fVar124;
                auVar28._24_4_ = fVar244 * fVar125;
                auVar28._28_4_ = auVar101._12_4_;
                auVar90 = vsubps_avx(auVar28,auVar27);
                auVar29._4_4_ = fVar304 * fVar239;
                auVar29._0_4_ = fVar300 * fVar231;
                auVar29._8_4_ = fVar306 * fVar240;
                auVar29._12_4_ = fVar308 * fVar241;
                auVar29._16_4_ = fVar310 * fVar242;
                auVar29._20_4_ = fVar312 * fVar243;
                auVar29._24_4_ = fVar314 * fVar244;
                auVar29._28_4_ = fVar245;
                auVar30._4_4_ = fVar276 * fVar173;
                auVar30._0_4_ = fVar272 * fVar160;
                auVar30._8_4_ = fVar277 * fVar175;
                auVar30._12_4_ = fVar278 * fVar177;
                auVar30._16_4_ = fVar279 * fVar179;
                auVar30._20_4_ = fVar280 * fVar181;
                auVar30._24_4_ = fVar281 * fVar183;
                auVar30._28_4_ = auVar16._28_4_ + fVar126;
                auVar104 = vsubps_avx(auVar30,auVar29);
                fVar160 = (local_1838->dir).field_0.m128[1];
                auVar273._4_4_ = fVar160;
                auVar273._0_4_ = fVar160;
                auVar273._8_4_ = fVar160;
                auVar273._12_4_ = fVar160;
                local_1820._16_4_ = fVar160;
                local_1820._0_16_ = auVar273;
                local_1820._20_4_ = fVar160;
                local_1820._24_4_ = fVar160;
                local_1820._28_4_ = fVar160;
                local_1780._4_4_ = (local_1838->dir).field_0.m128[2];
                fStack_1798 = (local_1838->dir).field_0.m128[0];
                local_17a0 = (RTCRayQueryContext *)CONCAT44(fStack_1798,fStack_1798);
                fStack_1794 = fStack_1798;
                fStack_1790 = fStack_1798;
                fStack_178c = fStack_1798;
                fStack_1788 = fStack_1798;
                fStack_1784 = fStack_1798;
                local_17e0._0_4_ =
                     fStack_1798 * auVar82._0_4_ +
                     fVar160 * auVar90._0_4_ + local_1780._4_4_ * auVar104._0_4_;
                local_17e0._4_4_ =
                     fStack_1798 * auVar82._4_4_ +
                     fVar160 * auVar90._4_4_ + local_1780._4_4_ * auVar104._4_4_;
                local_17e0._8_4_ =
                     fStack_1798 * auVar82._8_4_ +
                     fVar160 * auVar90._8_4_ + local_1780._4_4_ * auVar104._8_4_;
                local_17e0._12_4_ =
                     fStack_1798 * auVar82._12_4_ +
                     fVar160 * auVar90._12_4_ + local_1780._4_4_ * auVar104._12_4_;
                local_17e0._16_4_ =
                     fStack_1798 * auVar82._16_4_ +
                     fVar160 * auVar90._16_4_ + local_1780._4_4_ * auVar104._16_4_;
                local_17e0._20_4_ =
                     fStack_1798 * auVar82._20_4_ +
                     fVar160 * auVar90._20_4_ + local_1780._4_4_ * auVar104._20_4_;
                local_17e0._24_4_ =
                     fStack_1798 * auVar82._24_4_ +
                     fVar160 * auVar90._24_4_ + local_1780._4_4_ * auVar104._24_4_;
                local_17e0._28_4_ = auVar90._28_4_ + auVar90._28_4_ + auVar104._28_4_;
                local_13c0 = vsubps_avx(local_1640,auVar12);
                auVar82 = vsubps_avx(local_1660,auVar13);
                fVar177 = fVar95 + auVar12._0_4_;
                fVar181 = fVar96 + auVar12._4_4_;
                fVar185 = fVar97 + auVar12._8_4_;
                fVar204 = fVar98 + auVar12._12_4_;
                fVar206 = fVar99 + auVar12._16_4_;
                fVar209 = fVar100 + auVar12._20_4_;
                fVar239 = fVar144 + auVar12._24_4_;
                fVar173 = auVar12._28_4_;
                fVar240 = fVar285 + auVar13._0_4_;
                fVar241 = fVar288 + auVar13._4_4_;
                fVar242 = fVar290 + auVar13._8_4_;
                fVar243 = fVar292 + auVar13._12_4_;
                fVar244 = fVar294 + auVar13._16_4_;
                fVar208 = fVar296 + auVar13._20_4_;
                fVar210 = fVar298 + auVar13._24_4_;
                fVar301 = auVar82._0_4_;
                fVar305 = auVar82._4_4_;
                auVar31._4_4_ = fVar305 * fVar181;
                auVar31._0_4_ = fVar301 * fVar177;
                fVar307 = auVar82._8_4_;
                auVar31._8_4_ = fVar307 * fVar185;
                fVar309 = auVar82._12_4_;
                auVar31._12_4_ = fVar309 * fVar204;
                fVar311 = auVar82._16_4_;
                auVar31._16_4_ = fVar311 * fVar206;
                fVar313 = auVar82._20_4_;
                auVar31._20_4_ = fVar313 * fVar209;
                fVar315 = auVar82._24_4_;
                auVar31._24_4_ = fVar315 * fVar239;
                auVar31._28_4_ = fVar138;
                fVar175 = local_13c0._0_4_;
                fVar179 = local_13c0._4_4_;
                auVar32._4_4_ = fVar179 * fVar241;
                auVar32._0_4_ = fVar175 * fVar240;
                fVar183 = local_13c0._8_4_;
                auVar32._8_4_ = fVar183 * fVar242;
                fVar203 = local_13c0._12_4_;
                auVar32._12_4_ = fVar203 * fVar243;
                fVar205 = local_13c0._16_4_;
                auVar32._16_4_ = fVar205 * fVar244;
                fVar207 = local_13c0._20_4_;
                auVar32._20_4_ = fVar207 * fVar208;
                fVar231 = local_13c0._24_4_;
                auVar32._24_4_ = fVar231 * fVar210;
                auVar32._28_4_ = fVar126;
                auVar82 = vsubps_avx(auVar32,auVar31);
                auVar90 = vsubps_avx(local_16a0,auVar14);
                fVar286 = auVar90._0_4_;
                fVar289 = auVar90._4_4_;
                auVar33._4_4_ = fVar289 * fVar241;
                auVar33._0_4_ = fVar286 * fVar240;
                fVar291 = auVar90._8_4_;
                auVar33._8_4_ = fVar291 * fVar242;
                fVar293 = auVar90._12_4_;
                auVar33._12_4_ = fVar293 * fVar243;
                fVar295 = auVar90._16_4_;
                auVar33._16_4_ = fVar295 * fVar244;
                fVar297 = auVar90._20_4_;
                auVar33._20_4_ = fVar297 * fVar208;
                fVar299 = auVar90._24_4_;
                auVar33._24_4_ = fVar299 * fVar210;
                auVar33._28_4_ = fVar138 + auVar13._28_4_;
                fVar240 = fVar246 + auVar14._0_4_;
                fVar241 = fVar255 + auVar14._4_4_;
                fVar242 = fVar257 + auVar14._8_4_;
                fVar243 = fVar259 + auVar14._12_4_;
                fVar244 = fVar261 + auVar14._16_4_;
                fVar208 = fVar263 + auVar14._20_4_;
                fVar210 = fVar265 + auVar14._24_4_;
                auVar34._4_4_ = fVar305 * fVar241;
                auVar34._0_4_ = fVar301 * fVar240;
                auVar34._8_4_ = fVar307 * fVar242;
                auVar34._12_4_ = fVar309 * fVar243;
                auVar34._16_4_ = fVar311 * fVar244;
                auVar34._20_4_ = fVar313 * fVar208;
                auVar34._24_4_ = fVar315 * fVar210;
                auVar34._28_4_ = fVar245;
                auVar90 = vsubps_avx(auVar34,auVar33);
                auVar105 = local_13c0;
                auVar35._4_4_ = fVar241 * fVar179;
                auVar35._0_4_ = fVar240 * fVar175;
                auVar35._8_4_ = fVar242 * fVar183;
                auVar35._12_4_ = fVar243 * fVar203;
                auVar35._16_4_ = fVar244 * fVar205;
                auVar35._20_4_ = fVar208 * fVar207;
                auVar35._24_4_ = fVar210 * fVar231;
                auVar35._28_4_ = fVar245;
                auVar36._4_4_ = fVar289 * fVar181;
                auVar36._0_4_ = fVar286 * fVar177;
                auVar36._8_4_ = fVar291 * fVar185;
                auVar36._12_4_ = fVar293 * fVar204;
                auVar36._16_4_ = fVar295 * fVar206;
                auVar36._20_4_ = fVar297 * fVar209;
                auVar36._24_4_ = fVar299 * fVar239;
                auVar36._28_4_ = fVar126 + fVar173;
                auVar104 = vsubps_avx(auVar36,auVar35);
                fVar126 = auVar82._28_4_;
                local_13e0._0_4_ =
                     fStack_1798 * auVar82._0_4_ +
                     fVar160 * auVar90._0_4_ + local_1780._4_4_ * auVar104._0_4_;
                local_13e0._4_4_ =
                     fStack_1798 * auVar82._4_4_ +
                     fVar160 * auVar90._4_4_ + local_1780._4_4_ * auVar104._4_4_;
                local_13e0._8_4_ =
                     fStack_1798 * auVar82._8_4_ +
                     fVar160 * auVar90._8_4_ + local_1780._4_4_ * auVar104._8_4_;
                local_13e0._12_4_ =
                     fStack_1798 * auVar82._12_4_ +
                     fVar160 * auVar90._12_4_ + local_1780._4_4_ * auVar104._12_4_;
                local_13e0._16_4_ =
                     fStack_1798 * auVar82._16_4_ +
                     fVar160 * auVar90._16_4_ + local_1780._4_4_ * auVar104._16_4_;
                local_13e0._20_4_ =
                     fStack_1798 * auVar82._20_4_ +
                     fVar160 * auVar90._20_4_ + local_1780._4_4_ * auVar104._20_4_;
                local_13e0._24_4_ =
                     fStack_1798 * auVar82._24_4_ +
                     fVar160 * auVar90._24_4_ + local_1780._4_4_ * auVar104._24_4_;
                local_13e0._28_4_ = fVar126 + auVar90._28_4_ + auVar104._28_4_;
                local_17c0 = vsubps_avx(auVar14,auVar15);
                fVar245 = auVar14._0_4_ + auVar15._0_4_;
                fVar138 = auVar14._4_4_ + auVar15._4_4_;
                fVar139 = auVar14._8_4_ + auVar15._8_4_;
                fVar140 = auVar14._12_4_ + auVar15._12_4_;
                fVar141 = auVar14._16_4_ + auVar15._16_4_;
                fVar142 = auVar14._20_4_ + auVar15._20_4_;
                fVar143 = auVar14._24_4_ + auVar15._24_4_;
                auVar82 = vsubps_avx(auVar12,auVar16);
                fVar240 = auVar12._0_4_ + auVar16._0_4_;
                fVar241 = auVar12._4_4_ + auVar16._4_4_;
                fVar242 = auVar12._8_4_ + auVar16._8_4_;
                fVar243 = auVar12._12_4_ + auVar16._12_4_;
                fVar244 = auVar12._16_4_ + auVar16._16_4_;
                fVar208 = auVar12._20_4_ + auVar16._20_4_;
                fVar210 = auVar12._24_4_ + auVar16._24_4_;
                auVar12 = vsubps_avx(auVar13,auVar17);
                fVar177 = auVar13._0_4_ + auVar17._0_4_;
                fVar181 = auVar13._4_4_ + auVar17._4_4_;
                fVar185 = auVar13._8_4_ + auVar17._8_4_;
                fVar204 = auVar13._12_4_ + auVar17._12_4_;
                fVar206 = auVar13._16_4_ + auVar17._16_4_;
                fVar209 = auVar13._20_4_ + auVar17._20_4_;
                fVar239 = auVar13._24_4_ + auVar17._24_4_;
                fVar161 = auVar12._0_4_;
                fVar174 = auVar12._4_4_;
                auVar37._4_4_ = fVar174 * fVar241;
                auVar37._0_4_ = fVar161 * fVar240;
                fVar176 = auVar12._8_4_;
                auVar37._8_4_ = fVar176 * fVar242;
                fVar178 = auVar12._12_4_;
                auVar37._12_4_ = fVar178 * fVar243;
                fVar180 = auVar12._16_4_;
                auVar37._16_4_ = fVar180 * fVar244;
                fVar182 = auVar12._20_4_;
                auVar37._20_4_ = fVar182 * fVar208;
                fVar184 = auVar12._24_4_;
                auVar37._24_4_ = fVar184 * fVar210;
                auVar37._28_4_ = fVar173;
                fVar247 = auVar82._0_4_;
                fVar256 = auVar82._4_4_;
                auVar38._4_4_ = fVar256 * fVar181;
                auVar38._0_4_ = fVar247 * fVar177;
                fVar258 = auVar82._8_4_;
                auVar38._8_4_ = fVar258 * fVar185;
                fVar260 = auVar82._12_4_;
                auVar38._12_4_ = fVar260 * fVar204;
                fVar262 = auVar82._16_4_;
                auVar38._16_4_ = fVar262 * fVar206;
                fVar264 = auVar82._20_4_;
                auVar38._20_4_ = fVar264 * fVar209;
                fVar266 = auVar82._24_4_;
                auVar38._24_4_ = fVar266 * fVar239;
                auVar38._28_4_ = fVar126;
                auVar12 = vsubps_avx(auVar38,auVar37);
                fVar211 = local_17c0._0_4_;
                fVar226 = local_17c0._4_4_;
                auVar39._4_4_ = fVar226 * fVar181;
                auVar39._0_4_ = fVar211 * fVar177;
                fVar227 = local_17c0._8_4_;
                auVar39._8_4_ = fVar227 * fVar185;
                fVar228 = local_17c0._12_4_;
                auVar39._12_4_ = fVar228 * fVar204;
                fVar229 = local_17c0._16_4_;
                auVar39._16_4_ = fVar229 * fVar206;
                fVar230 = local_17c0._20_4_;
                auVar39._20_4_ = fVar230 * fVar209;
                fVar209 = local_17c0._24_4_;
                auVar39._24_4_ = fVar209 * fVar239;
                auVar39._28_4_ = auVar13._28_4_ + auVar17._28_4_;
                auVar40._4_4_ = fVar174 * fVar138;
                auVar40._0_4_ = fVar161 * fVar245;
                auVar40._8_4_ = fVar176 * fVar139;
                auVar40._12_4_ = fVar178 * fVar140;
                auVar40._16_4_ = fVar180 * fVar141;
                auVar40._20_4_ = fVar182 * fVar142;
                auVar40._24_4_ = fVar184 * fVar143;
                auVar40._28_4_ = fVar126;
                auVar13 = vsubps_avx(auVar40,auVar39);
                auVar41._4_4_ = fVar256 * fVar138;
                auVar41._0_4_ = fVar247 * fVar245;
                auVar41._8_4_ = fVar258 * fVar139;
                auVar41._12_4_ = fVar260 * fVar140;
                auVar41._16_4_ = fVar262 * fVar141;
                auVar41._20_4_ = fVar264 * fVar142;
                auVar41._24_4_ = fVar266 * fVar143;
                auVar41._28_4_ = auVar14._28_4_ + auVar15._28_4_;
                auVar42._4_4_ = fVar226 * fVar241;
                auVar42._0_4_ = fVar211 * fVar240;
                auVar42._8_4_ = fVar227 * fVar242;
                auVar42._12_4_ = fVar228 * fVar243;
                auVar42._16_4_ = fVar229 * fVar244;
                auVar42._20_4_ = fVar230 * fVar208;
                auVar42._24_4_ = fVar209 * fVar210;
                auVar42._28_4_ = fVar173 + auVar16._28_4_;
                auVar14 = vsubps_avx(auVar42,auVar41);
                local_1780._0_4_ = local_1780._4_4_;
                fStack_1778 = local_1780._4_4_;
                fStack_1774 = local_1780._4_4_;
                fStack_1770 = local_1780._4_4_;
                fStack_176c = local_1780._4_4_;
                fStack_1768 = local_1780._4_4_;
                fStack_1764 = local_1780._4_4_;
                auVar92._0_4_ =
                     fStack_1798 * auVar12._0_4_ +
                     fVar160 * auVar13._0_4_ + local_1780._4_4_ * auVar14._0_4_;
                auVar92._4_4_ =
                     fStack_1798 * auVar12._4_4_ +
                     fVar160 * auVar13._4_4_ + local_1780._4_4_ * auVar14._4_4_;
                auVar92._8_4_ =
                     fStack_1798 * auVar12._8_4_ +
                     fVar160 * auVar13._8_4_ + local_1780._4_4_ * auVar14._8_4_;
                auVar92._12_4_ =
                     fStack_1798 * auVar12._12_4_ +
                     fVar160 * auVar13._12_4_ + local_1780._4_4_ * auVar14._12_4_;
                auVar92._16_4_ =
                     fStack_1798 * auVar12._16_4_ +
                     fVar160 * auVar13._16_4_ + local_1780._4_4_ * auVar14._16_4_;
                auVar92._20_4_ =
                     fStack_1798 * auVar12._20_4_ +
                     fVar160 * auVar13._20_4_ + local_1780._4_4_ * auVar14._20_4_;
                auVar92._24_4_ =
                     fStack_1798 * auVar12._24_4_ +
                     fVar160 * auVar13._24_4_ + local_1780._4_4_ * auVar14._24_4_;
                auVar92._28_4_ = auVar14._28_4_ + auVar13._28_4_ + auVar14._28_4_;
                local_1400._0_4_ = auVar92._0_4_ + local_17e0._0_4_ + local_13e0._0_4_;
                local_1400._4_4_ = auVar92._4_4_ + local_17e0._4_4_ + local_13e0._4_4_;
                local_1400._8_4_ = auVar92._8_4_ + local_17e0._8_4_ + local_13e0._8_4_;
                local_1400._12_4_ = auVar92._12_4_ + local_17e0._12_4_ + local_13e0._12_4_;
                local_1400._16_4_ = auVar92._16_4_ + local_17e0._16_4_ + local_13e0._16_4_;
                local_1400._20_4_ = auVar92._20_4_ + local_17e0._20_4_ + local_13e0._20_4_;
                local_1400._24_4_ = auVar92._24_4_ + local_17e0._24_4_ + local_13e0._24_4_;
                local_1400._28_4_ = auVar92._28_4_ + local_17e0._28_4_ + local_13e0._28_4_;
                auVar14 = vminps_avx(local_17e0,local_13e0);
                auVar14 = vminps_avx(auVar14,auVar92);
                auVar135._8_4_ = 0x7fffffff;
                auVar135._0_8_ = 0x7fffffff7fffffff;
                auVar135._12_4_ = 0x7fffffff;
                auVar135._16_4_ = 0x7fffffff;
                auVar135._20_4_ = 0x7fffffff;
                auVar135._24_4_ = 0x7fffffff;
                auVar135._28_4_ = 0x7fffffff;
                local_1520 = vandps_avx(local_1400,auVar135);
                fVar126 = local_1520._0_4_ * 1.1920929e-07;
                fVar173 = local_1520._4_4_ * 1.1920929e-07;
                auVar43._4_4_ = fVar173;
                auVar43._0_4_ = fVar126;
                fVar177 = local_1520._8_4_ * 1.1920929e-07;
                auVar43._8_4_ = fVar177;
                fVar181 = local_1520._12_4_ * 1.1920929e-07;
                auVar43._12_4_ = fVar181;
                fVar185 = local_1520._16_4_ * 1.1920929e-07;
                auVar43._16_4_ = fVar185;
                fVar204 = local_1520._20_4_ * 1.1920929e-07;
                auVar43._20_4_ = fVar204;
                fVar206 = local_1520._24_4_ * 1.1920929e-07;
                auVar43._24_4_ = fVar206;
                auVar43._28_4_ = 0x34000000;
                auVar137 = ZEXT3264(auVar43);
                auVar157._0_8_ = CONCAT44(fVar173,fVar126) ^ 0x8000000080000000;
                auVar157._8_4_ = -fVar177;
                auVar157._12_4_ = -fVar181;
                auVar157._16_4_ = -fVar185;
                auVar157._20_4_ = -fVar204;
                auVar157._24_4_ = -fVar206;
                auVar157._28_4_ = 0xb4000000;
                auVar14 = vcmpps_avx(auVar14,auVar157,5);
                auVar123 = ZEXT3264(auVar14);
                auVar13 = vmaxps_avx(local_17e0,local_13e0);
                auVar12 = vmaxps_avx(auVar13,auVar92);
                auVar12 = vcmpps_avx(auVar12,auVar43,2);
                local_1420 = vorps_avx(auVar14,auVar12);
                auVar107 = ZEXT3264(local_1420);
                auVar94 = ZEXT3264(local_1540);
                auVar12 = local_1540 & local_1420;
                if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar12 >> 0x7f,0) != '\0') ||
                      (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar12 >> 0xbf,0) != '\0') ||
                    (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar12[0x1f] < '\0') {
                  auVar44._4_4_ = fVar109 * fVar179;
                  auVar44._0_4_ = fVar108 * fVar175;
                  auVar44._8_4_ = fVar110 * fVar183;
                  auVar44._12_4_ = fVar86 * fVar203;
                  auVar44._16_4_ = fVar87 * fVar205;
                  auVar44._20_4_ = fVar124 * fVar207;
                  auVar44._24_4_ = fVar125 * fVar231;
                  auVar44._28_4_ = local_1540._28_4_;
                  auVar45._4_4_ = fVar305 * fVar304;
                  auVar45._0_4_ = fVar301 * fVar300;
                  auVar45._8_4_ = fVar307 * fVar306;
                  auVar45._12_4_ = fVar309 * fVar308;
                  auVar45._16_4_ = fVar311 * fVar310;
                  auVar45._20_4_ = fVar313 * fVar312;
                  auVar45._24_4_ = fVar315 * fVar314;
                  auVar45._28_4_ = auVar14._28_4_;
                  auVar15 = vsubps_avx(auVar45,auVar44);
                  auVar46._4_4_ = fVar305 * fVar256;
                  auVar46._0_4_ = fVar301 * fVar247;
                  auVar46._8_4_ = fVar307 * fVar258;
                  auVar46._12_4_ = fVar309 * fVar260;
                  auVar46._16_4_ = fVar311 * fVar262;
                  auVar46._20_4_ = fVar313 * fVar264;
                  auVar46._24_4_ = fVar315 * fVar266;
                  auVar46._28_4_ = 0x34000000;
                  auVar47._4_4_ = fVar179 * fVar174;
                  auVar47._0_4_ = fVar175 * fVar161;
                  auVar47._8_4_ = fVar183 * fVar176;
                  auVar47._12_4_ = fVar203 * fVar178;
                  auVar47._16_4_ = fVar205 * fVar180;
                  auVar47._20_4_ = fVar207 * fVar182;
                  auVar47._24_4_ = fVar231 * fVar184;
                  auVar47._28_4_ = auVar13._28_4_;
                  auVar16 = vsubps_avx(auVar47,auVar46);
                  auVar237._8_4_ = 0x7fffffff;
                  auVar237._0_8_ = 0x7fffffff7fffffff;
                  auVar237._12_4_ = 0x7fffffff;
                  auVar237._16_4_ = 0x7fffffff;
                  auVar237._20_4_ = 0x7fffffff;
                  auVar237._24_4_ = 0x7fffffff;
                  auVar237._28_4_ = 0x7fffffff;
                  auVar14 = vandps_avx(auVar237,auVar44);
                  auVar12 = vandps_avx(auVar237,auVar46);
                  auVar14 = vcmpps_avx(auVar14,auVar12,1);
                  auVar13 = vblendvps_avx(auVar16,auVar15,auVar14);
                  auVar94 = ZEXT3264(auVar13);
                  auVar48._4_4_ = fVar289 * fVar174;
                  auVar48._0_4_ = fVar286 * fVar161;
                  auVar48._8_4_ = fVar291 * fVar176;
                  auVar48._12_4_ = fVar293 * fVar178;
                  auVar48._16_4_ = fVar295 * fVar180;
                  auVar48._20_4_ = fVar297 * fVar182;
                  auVar48._24_4_ = fVar299 * fVar184;
                  auVar48._28_4_ = auVar15._28_4_;
                  auVar49._4_4_ = fVar109 * fVar289;
                  auVar49._0_4_ = fVar108 * fVar286;
                  auVar49._8_4_ = fVar110 * fVar291;
                  auVar49._12_4_ = fVar86 * fVar293;
                  auVar49._16_4_ = fVar87 * fVar295;
                  auVar49._20_4_ = fVar124 * fVar297;
                  auVar49._24_4_ = fVar125 * fVar299;
                  auVar49._28_4_ = auVar12._28_4_;
                  auVar50._4_4_ = fVar276 * fVar305;
                  auVar50._0_4_ = fVar272 * fVar301;
                  auVar50._8_4_ = fVar277 * fVar307;
                  auVar50._12_4_ = fVar278 * fVar309;
                  auVar50._16_4_ = fVar279 * fVar311;
                  auVar50._20_4_ = fVar280 * fVar313;
                  auVar50._24_4_ = fVar281 * fVar315;
                  auVar50._28_4_ = auVar16._28_4_;
                  auVar16 = vsubps_avx(auVar49,auVar50);
                  auVar51._4_4_ = fVar305 * fVar226;
                  auVar51._0_4_ = fVar301 * fVar211;
                  auVar51._8_4_ = fVar307 * fVar227;
                  auVar51._12_4_ = fVar309 * fVar228;
                  auVar51._16_4_ = fVar311 * fVar229;
                  auVar51._20_4_ = fVar313 * fVar230;
                  auVar51._24_4_ = fVar315 * fVar209;
                  auVar51._28_4_ = local_17c0._28_4_;
                  auVar15 = vsubps_avx(auVar51,auVar48);
                  auVar14 = vandps_avx(auVar237,auVar50);
                  auVar12 = vandps_avx(auVar237,auVar48);
                  auVar12 = vcmpps_avx(auVar14,auVar12,1);
                  auVar15 = vblendvps_avx(auVar15,auVar16,auVar12);
                  auVar52._4_4_ = fVar179 * fVar226;
                  auVar52._0_4_ = fVar175 * fVar211;
                  auVar52._8_4_ = fVar183 * fVar227;
                  auVar52._12_4_ = fVar203 * fVar228;
                  auVar52._16_4_ = fVar205 * fVar229;
                  auVar52._20_4_ = fVar207 * fVar230;
                  auVar52._24_4_ = fVar231 * fVar209;
                  auVar52._28_4_ = auVar12._28_4_;
                  auVar53._4_4_ = fVar276 * fVar179;
                  auVar53._0_4_ = fVar272 * fVar175;
                  auVar53._8_4_ = fVar277 * fVar183;
                  auVar53._12_4_ = fVar278 * fVar203;
                  auVar53._16_4_ = fVar279 * fVar205;
                  auVar53._20_4_ = fVar280 * fVar207;
                  auVar53._24_4_ = fVar281 * fVar231;
                  auVar53._28_4_ = auVar16._28_4_;
                  auVar54._4_4_ = fVar289 * fVar304;
                  auVar54._0_4_ = fVar286 * fVar300;
                  auVar54._8_4_ = fVar291 * fVar306;
                  auVar54._12_4_ = fVar293 * fVar308;
                  auVar54._16_4_ = fVar295 * fVar310;
                  auVar54._20_4_ = fVar297 * fVar312;
                  auVar54._24_4_ = fVar299 * fVar314;
                  auVar54._28_4_ = auVar14._28_4_;
                  auVar55._4_4_ = fVar289 * fVar256;
                  auVar55._0_4_ = fVar286 * fVar247;
                  auVar55._8_4_ = fVar291 * fVar258;
                  auVar55._12_4_ = fVar293 * fVar260;
                  auVar55._16_4_ = fVar295 * fVar262;
                  auVar55._20_4_ = fVar297 * fVar264;
                  auVar55._24_4_ = fVar299 * fVar266;
                  auVar55._28_4_ = local_13c0._28_4_;
                  auVar17 = vsubps_avx(auVar53,auVar54);
                  auVar82 = vsubps_avx(auVar55,auVar52);
                  auVar14 = vandps_avx(auVar237,auVar54);
                  auVar12 = vandps_avx(auVar237,auVar52);
                  auVar16 = vcmpps_avx(auVar14,auVar12,1);
                  auVar12 = vblendvps_avx(auVar82,auVar17,auVar16);
                  auVar107 = ZEXT3264(auVar12);
                  fVar183 = auVar12._0_4_;
                  fVar185 = auVar12._4_4_;
                  fVar86 = auVar12._8_4_;
                  fVar203 = auVar12._12_4_;
                  fVar204 = auVar12._16_4_;
                  fVar87 = auVar12._20_4_;
                  fVar205 = auVar12._24_4_;
                  fVar239 = auVar15._0_4_;
                  fVar240 = auVar15._4_4_;
                  fVar241 = auVar15._8_4_;
                  fVar242 = auVar15._12_4_;
                  fVar243 = auVar15._16_4_;
                  fVar244 = auVar15._20_4_;
                  fVar181 = auVar17._28_4_;
                  fVar208 = auVar15._24_4_;
                  fVar126 = auVar13._0_4_;
                  fVar173 = auVar13._4_4_;
                  fVar108 = auVar13._8_4_;
                  fVar175 = auVar13._12_4_;
                  fVar177 = auVar13._16_4_;
                  fVar109 = auVar13._20_4_;
                  fVar179 = auVar13._24_4_;
                  fVar110 = fStack_1798 * fVar126 + fVar239 * fVar160 + fVar183 * local_1780._4_4_;
                  fVar206 = fStack_1798 * fVar173 + fVar240 * fVar160 + fVar185 * local_1780._4_4_;
                  fVar124 = fStack_1798 * fVar108 + fVar241 * fVar160 + fVar86 * local_1780._4_4_;
                  fVar207 = fStack_1798 * fVar175 + fVar242 * fVar160 + fVar203 * local_1780._4_4_;
                  fVar209 = fStack_1798 * fVar177 + fVar243 * fVar160 + fVar204 * local_1780._4_4_;
                  fVar125 = fStack_1798 * fVar109 + fVar244 * fVar160 + fVar87 * local_1780._4_4_;
                  fVar160 = fStack_1798 * fVar179 + fVar208 * fVar160 + fVar205 * local_1780._4_4_;
                  fVar231 = fVar181 + fVar181 + auVar16._28_4_;
                  auVar121._0_4_ = fVar110 + fVar110;
                  auVar121._4_4_ = fVar206 + fVar206;
                  auVar121._8_4_ = fVar124 + fVar124;
                  auVar121._12_4_ = fVar207 + fVar207;
                  auVar121._16_4_ = fVar209 + fVar209;
                  auVar121._20_4_ = fVar125 + fVar125;
                  auVar121._24_4_ = fVar160 + fVar160;
                  auVar121._28_4_ = fVar231 + fVar231;
                  fVar110 = auVar14._28_4_;
                  auVar14 = vrcpps_avx(auVar121);
                  fVar206 = fVar126 * fVar246 + fVar239 * fVar95 + fVar183 * fVar285;
                  fVar124 = fVar173 * fVar255 + fVar240 * fVar96 + fVar185 * fVar288;
                  fVar207 = fVar108 * fVar257 + fVar241 * fVar97 + fVar86 * fVar290;
                  fVar209 = fVar175 * fVar259 + fVar242 * fVar98 + fVar203 * fVar292;
                  fVar125 = fVar177 * fVar261 + fVar243 * fVar99 + fVar204 * fVar294;
                  fVar231 = fVar109 * fVar263 + fVar244 * fVar100 + fVar87 * fVar296;
                  fVar144 = fVar179 * fVar265 + fVar208 * fVar144 + fVar205 * fVar298;
                  fVar181 = fVar110 + fVar110 + fVar181;
                  fVar160 = auVar14._0_4_;
                  fVar95 = auVar14._4_4_;
                  auVar56._4_4_ = auVar121._4_4_ * fVar95;
                  auVar56._0_4_ = auVar121._0_4_ * fVar160;
                  fVar96 = auVar14._8_4_;
                  auVar56._8_4_ = auVar121._8_4_ * fVar96;
                  fVar97 = auVar14._12_4_;
                  auVar56._12_4_ = auVar121._12_4_ * fVar97;
                  fVar98 = auVar14._16_4_;
                  auVar56._16_4_ = auVar121._16_4_ * fVar98;
                  fVar99 = auVar14._20_4_;
                  auVar56._20_4_ = auVar121._20_4_ * fVar99;
                  fVar100 = auVar14._24_4_;
                  auVar56._24_4_ = auVar121._24_4_ * fVar100;
                  auVar56._28_4_ = fVar110;
                  auVar223._8_4_ = 0x3f800000;
                  auVar223._0_8_ = 0x3f8000003f800000;
                  auVar223._12_4_ = 0x3f800000;
                  auVar223._16_4_ = 0x3f800000;
                  auVar223._20_4_ = 0x3f800000;
                  auVar223._24_4_ = 0x3f800000;
                  auVar223._28_4_ = 0x3f800000;
                  auVar14 = vsubps_avx(auVar223,auVar56);
                  uVar3 = *(undefined4 *)((long)&(local_1838->org).field_0 + 0xc);
                  auVar200._4_4_ = uVar3;
                  auVar200._0_4_ = uVar3;
                  auVar200._8_4_ = uVar3;
                  auVar200._12_4_ = uVar3;
                  auVar200._16_4_ = uVar3;
                  auVar200._20_4_ = uVar3;
                  auVar200._24_4_ = uVar3;
                  auVar200._28_4_ = uVar3;
                  local_1280._4_4_ = (fVar124 + fVar124) * (fVar95 + fVar95 * auVar14._4_4_);
                  local_1280._0_4_ = (fVar206 + fVar206) * (fVar160 + fVar160 * auVar14._0_4_);
                  local_1280._8_4_ = (fVar207 + fVar207) * (fVar96 + fVar96 * auVar14._8_4_);
                  local_1280._12_4_ = (fVar209 + fVar209) * (fVar97 + fVar97 * auVar14._12_4_);
                  local_1280._16_4_ = (fVar125 + fVar125) * (fVar98 + fVar98 * auVar14._16_4_);
                  local_1280._20_4_ = (fVar231 + fVar231) * (fVar99 + fVar99 * auVar14._20_4_);
                  local_1280._24_4_ = (fVar144 + fVar144) * (fVar100 + fVar100 * auVar14._24_4_);
                  local_1280._28_4_ = fVar181 + fVar181;
                  auVar137 = ZEXT3264(local_1280);
                  auVar14 = vcmpps_avx(auVar200,local_1280,2);
                  fVar160 = local_1838->tfar;
                  auVar201._4_4_ = fVar160;
                  auVar201._0_4_ = fVar160;
                  auVar201._8_4_ = fVar160;
                  auVar201._12_4_ = fVar160;
                  auVar201._16_4_ = fVar160;
                  auVar201._20_4_ = fVar160;
                  auVar201._24_4_ = fVar160;
                  auVar201._28_4_ = fVar160;
                  auVar12 = vcmpps_avx(local_1280,auVar201,2);
                  auVar14 = vandps_avx(auVar14,auVar12);
                  auVar12 = vcmpps_avx(auVar121,_DAT_01faff00,4);
                  auVar14 = vandps_avx(auVar12,auVar14);
                  auVar77 = vpslld_avx(auVar14._0_16_,0x1f);
                  auVar149 = vpsrad_avx(auVar77,0x1f);
                  auVar77 = vpslld_avx(auVar14._16_16_,0x1f);
                  auVar77 = vpsrad_avx(auVar77,0x1f);
                  auVar122._16_16_ = auVar77;
                  auVar122._0_16_ = auVar149;
                  auVar123 = ZEXT3264(auVar122);
                  auVar14 = vandps_avx(local_1420,local_1540);
                  auVar12 = auVar14 & auVar122;
                  if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar12 >> 0x7f,0) != '\0') ||
                        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar12 >> 0xbf,0) != '\0') ||
                      (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar12[0x1f] < '\0') {
                    auVar5._0_4_ = local_1838->tfar;
                    auVar5._4_4_ = local_1838->mask;
                    auVar5._8_4_ = local_1838->id;
                    auVar5._12_4_ = local_1838->flags;
                    local_12e0 = vandps_avx(auVar122,auVar14);
                    auVar123 = ZEXT3264(local_12e0);
                    uVar71 = vextractps_avx(auVar5,1);
                    local_1320 = local_1400;
                    local_1300 = &local_1841;
                    auVar14 = vsubps_avx(local_1400,local_13e0);
                    auVar14 = vblendvps_avx(local_17e0,auVar14,local_1480);
                    auVar12 = vsubps_avx(local_1400,local_17e0);
                    auVar12 = vblendvps_avx(local_13e0,auVar12,local_1480);
                    auVar171._8_4_ = 0xbf800000;
                    auVar171._0_8_ = 0xbf800000bf800000;
                    auVar171._12_4_ = 0xbf800000;
                    auVar171._16_4_ = 0xbf800000;
                    auVar171._20_4_ = 0xbf800000;
                    auVar171._24_4_ = 0xbf800000;
                    auVar171._28_4_ = 0xbf800000;
                    auVar224._8_4_ = 0x3f800000;
                    auVar224._0_8_ = 0x3f8000003f800000;
                    auVar224._12_4_ = 0x3f800000;
                    auVar224._16_4_ = 0x3f800000;
                    auVar224._20_4_ = 0x3f800000;
                    auVar224._24_4_ = 0x3f800000;
                    auVar224._28_4_ = 0x3f800000;
                    auVar15 = vblendvps_avx(auVar224,auVar171,local_1480);
                    fVar160 = auVar15._0_4_;
                    fVar95 = auVar15._4_4_;
                    fVar96 = auVar15._8_4_;
                    fVar97 = auVar15._12_4_;
                    fVar98 = auVar15._16_4_;
                    fVar99 = auVar15._20_4_;
                    uStack_1244 = auVar13._28_4_;
                    fVar100 = auVar15._24_4_;
                    local_1260[0] = fVar160 * fVar126;
                    local_1260[1] = fVar95 * fVar173;
                    local_1260[2] = fVar96 * fVar108;
                    local_1260[3] = fVar97 * fVar175;
                    fStack_1250 = fVar98 * fVar177;
                    fStack_124c = fVar99 * fVar109;
                    fStack_1248 = fVar100 * fVar179;
                    local_1240[0] = fVar239 * fVar160;
                    local_1240[1] = fVar240 * fVar95;
                    local_1240[2] = fVar241 * fVar96;
                    local_1240[3] = fVar242 * fVar97;
                    fStack_1230 = fVar243 * fVar98;
                    fStack_122c = fVar244 * fVar99;
                    fStack_1228 = fVar208 * fVar100;
                    uStack_1224 = uStack_1244;
                    local_1220[0] = fVar160 * fVar183;
                    local_1220[1] = fVar95 * fVar185;
                    local_1220[2] = fVar96 * fVar86;
                    local_1220[3] = fVar97 * fVar203;
                    fStack_1210 = fVar98 * fVar204;
                    fStack_120c = fVar99 * fVar87;
                    fStack_1208 = fVar100 * fVar205;
                    uStack_1204 = uStack_1244;
                    auVar77 = vpshufd_avx(ZEXT416(local_1828),0);
                    auVar77 = vpaddd_avx(auVar77,_DAT_01fab9b0);
                    auVar149 = vpshufd_avx(ZEXT416(local_182c),0);
                    auVar149 = vpaddd_avx(auVar149,_DAT_01fab9c0);
                    auVar167._0_4_ = (float)(int)(*(ushort *)(local_1710 + 8 + local_1718) - 1);
                    auVar167._4_12_ = auVar273._4_12_;
                    auVar78 = vrcpss_avx(auVar167,auVar167);
                    auVar191._0_4_ = (float)(int)(*(ushort *)(local_1710 + 10 + local_1718) - 1);
                    auVar191._4_12_ = auVar273._4_12_;
                    auVar127 = vrcpss_avx(auVar191,auVar191);
                    auVar93._16_16_ = auVar77;
                    auVar93._0_16_ = auVar77;
                    auVar13 = vcvtdq2ps_avx(auVar93);
                    fVar144 = auVar13._28_4_ + auVar14._28_4_;
                    auVar77 = ZEXT416((uint)(auVar78._0_4_ * (2.0 - auVar78._0_4_ * auVar167._0_4_))
                                     );
                    auVar77 = vshufps_avx(auVar77,auVar77,0);
                    fVar160 = (local_1400._0_4_ * auVar13._0_4_ + auVar14._0_4_) * auVar77._0_4_;
                    fVar95 = (local_1400._4_4_ * auVar13._4_4_ + auVar14._4_4_) * auVar77._4_4_;
                    local_1360._4_4_ = fVar95;
                    local_1360._0_4_ = fVar160;
                    fVar96 = (local_1400._8_4_ * auVar13._8_4_ + auVar14._8_4_) * auVar77._8_4_;
                    local_1360._8_4_ = fVar96;
                    fVar97 = (local_1400._12_4_ * auVar13._12_4_ + auVar14._12_4_) * auVar77._12_4_;
                    local_1360._12_4_ = fVar97;
                    fVar98 = (local_1400._16_4_ * auVar13._16_4_ + auVar14._16_4_) * auVar77._0_4_;
                    local_1360._16_4_ = fVar98;
                    fVar99 = (local_1400._20_4_ * auVar13._20_4_ + auVar14._20_4_) * auVar77._4_4_;
                    local_1360._20_4_ = fVar99;
                    fVar100 = (local_1400._24_4_ * auVar13._24_4_ + auVar14._24_4_) * auVar77._8_4_;
                    local_1360._24_4_ = fVar100;
                    local_1360._28_4_ = fVar144;
                    auVar94 = ZEXT3264(local_1360);
                    auVar106._16_16_ = auVar149;
                    auVar106._0_16_ = auVar149;
                    auVar14 = vcvtdq2ps_avx(auVar106);
                    auVar77 = ZEXT416((uint)(auVar127._0_4_ *
                                            (2.0 - auVar127._0_4_ * auVar191._0_4_)));
                    auVar77 = vshufps_avx(auVar77,auVar77,0);
                    auVar137 = ZEXT3264(CONCAT1616(auVar77,auVar77));
                    fVar126 = (local_1400._0_4_ * auVar14._0_4_ + auVar12._0_4_) * auVar77._0_4_;
                    fVar173 = (local_1400._4_4_ * auVar14._4_4_ + auVar12._4_4_) * auVar77._4_4_;
                    local_1340._4_4_ = fVar173;
                    local_1340._0_4_ = fVar126;
                    fVar108 = (local_1400._8_4_ * auVar14._8_4_ + auVar12._8_4_) * auVar77._8_4_;
                    local_1340._8_4_ = fVar108;
                    fVar175 = (local_1400._12_4_ * auVar14._12_4_ + auVar12._12_4_) * auVar77._12_4_
                    ;
                    local_1340._12_4_ = fVar175;
                    fVar177 = (local_1400._16_4_ * auVar14._16_4_ + auVar12._16_4_) * auVar77._0_4_;
                    local_1340._16_4_ = fVar177;
                    fVar109 = (local_1400._20_4_ * auVar14._20_4_ + auVar12._20_4_) * auVar77._4_4_;
                    local_1340._20_4_ = fVar109;
                    fVar179 = (local_1400._24_4_ * auVar14._24_4_ + auVar12._24_4_) * auVar77._8_4_;
                    local_1340._24_4_ = fVar179;
                    local_1340._28_4_ = auVar14._28_4_ + auVar12._28_4_;
                    auVar107 = ZEXT3264(local_1340);
                    pGVar65 = (local_1708->geometries).items[uVar73].ptr;
                    if ((pGVar65->mask & uVar71) != 0) {
                      pRVar67 = local_1840->args;
                      if ((pRVar67->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar65->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_002f42d6:
                        local_1838->tfar = -INFINITY;
                        return;
                      }
                      auVar14 = vrcpps_avx(local_1400);
                      fVar181 = auVar14._0_4_;
                      fVar110 = auVar14._4_4_;
                      auVar57._4_4_ = local_1400._4_4_ * fVar110;
                      auVar57._0_4_ = local_1400._0_4_ * fVar181;
                      fVar183 = auVar14._8_4_;
                      auVar57._8_4_ = local_1400._8_4_ * fVar183;
                      fVar185 = auVar14._12_4_;
                      auVar57._12_4_ = local_1400._12_4_ * fVar185;
                      fVar86 = auVar14._16_4_;
                      auVar57._16_4_ = local_1400._16_4_ * fVar86;
                      fVar203 = auVar14._20_4_;
                      auVar57._20_4_ = local_1400._20_4_ * fVar203;
                      fVar204 = auVar14._24_4_;
                      auVar57._24_4_ = local_1400._24_4_ * fVar204;
                      auVar57._28_4_ = local_1400._28_4_;
                      auVar158._8_4_ = 0x3f800000;
                      auVar158._0_8_ = 0x3f8000003f800000;
                      auVar158._12_4_ = 0x3f800000;
                      auVar158._16_4_ = 0x3f800000;
                      auVar158._20_4_ = 0x3f800000;
                      auVar158._24_4_ = 0x3f800000;
                      auVar158._28_4_ = 0x3f800000;
                      auVar12 = vsubps_avx(auVar158,auVar57);
                      auVar85._0_4_ = fVar181 + fVar181 * auVar12._0_4_;
                      auVar85._4_4_ = fVar110 + fVar110 * auVar12._4_4_;
                      auVar85._8_4_ = fVar183 + fVar183 * auVar12._8_4_;
                      auVar85._12_4_ = fVar185 + fVar185 * auVar12._12_4_;
                      auVar85._16_4_ = fVar86 + fVar86 * auVar12._16_4_;
                      auVar85._20_4_ = fVar203 + fVar203 * auVar12._20_4_;
                      auVar85._24_4_ = fVar204 + fVar204 * auVar12._24_4_;
                      auVar85._28_4_ = auVar14._28_4_ + auVar12._28_4_;
                      auVar136._8_4_ = 0x219392ef;
                      auVar136._0_8_ = 0x219392ef219392ef;
                      auVar136._12_4_ = 0x219392ef;
                      auVar136._16_4_ = 0x219392ef;
                      auVar136._20_4_ = 0x219392ef;
                      auVar136._24_4_ = 0x219392ef;
                      auVar136._28_4_ = 0x219392ef;
                      auVar14 = vcmpps_avx(local_1520,auVar136,5);
                      auVar137 = ZEXT3264(auVar14);
                      auVar14 = vandps_avx(auVar14,auVar85);
                      auVar58._4_4_ = fVar95 * auVar14._4_4_;
                      auVar58._0_4_ = fVar160 * auVar14._0_4_;
                      auVar58._8_4_ = fVar96 * auVar14._8_4_;
                      auVar58._12_4_ = fVar97 * auVar14._12_4_;
                      auVar58._16_4_ = fVar98 * auVar14._16_4_;
                      auVar58._20_4_ = fVar99 * auVar14._20_4_;
                      auVar58._24_4_ = fVar100 * auVar14._24_4_;
                      auVar58._28_4_ = fVar144;
                      local_12c0 = vminps_avx(auVar58,auVar158);
                      auVar94 = ZEXT3264(local_12c0);
                      auVar59._4_4_ = fVar173 * auVar14._4_4_;
                      auVar59._0_4_ = fVar126 * auVar14._0_4_;
                      auVar59._8_4_ = fVar108 * auVar14._8_4_;
                      auVar59._12_4_ = fVar175 * auVar14._12_4_;
                      auVar59._16_4_ = fVar177 * auVar14._16_4_;
                      auVar59._20_4_ = fVar109 * auVar14._20_4_;
                      auVar59._24_4_ = fVar179 * auVar14._24_4_;
                      auVar59._28_4_ = auVar14._28_4_;
                      local_12a0 = vminps_avx(auVar59,auVar158);
                      iVar69 = vmovmskps_avx(local_12e0);
                      uVar70 = CONCAT44((int)((ulong)local_1718 >> 0x20),iVar69);
                      lVar72 = 0;
                      if (uVar70 != 0) {
                        for (; (uVar70 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                        }
                      }
                      if (iVar69 != 0) {
                        local_17a0 = local_1840->user;
                        local_17c0._0_8_ = pRVar67;
                        local_16a0._0_16_ = auVar5;
                        local_17e0._0_8_ = pGVar65;
                        local_13c0 = auVar105;
                        do {
                          local_1820._0_8_ = uVar70;
                          local_16f4 = *(undefined4 *)(local_12c0 + lVar72 * 4);
                          local_16f0 = *(undefined4 *)(local_12a0 + lVar72 * 4);
                          local_1838->tfar = local_1260[lVar72 + -8];
                          local_1700 = local_1260[lVar72];
                          auVar77 = ZEXT416((uint)local_1700);
                          local_16fc = local_1240[lVar72];
                          auVar149 = ZEXT416((uint)local_16fc);
                          local_1780 = lVar72;
                          local_16f8 = local_1220[lVar72];
                          auVar78 = ZEXT416((uint)local_16f8);
                          local_16ec = (undefined4)local_1748;
                          local_16e8 = local_17f0._0_4_;
                          local_16e4 = local_17a0->instID[0];
                          local_16e0 = local_17a0->instPrimID[0];
                          local_1824 = -1;
                          local_16d0.valid = &local_1824;
                          local_16d0.geometryUserPtr = pGVar65->userPtr;
                          local_16d0.context = local_17a0;
                          local_16d0.ray = (RTCRayN *)local_1838;
                          local_16d0.hit = (RTCHitN *)&local_1700;
                          local_16d0.N = 1;
                          if (pGVar65->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002f417f:
                            if ((pRVar67->filter == (RTCFilterFunctionN)0x0) ||
                               (((pRVar67->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                                 RTC_RAY_QUERY_FLAG_INCOHERENT &&
                                ((*(byte *)(local_17e0._0_8_ + 0x3e) & 0x40) == 0))))
                            goto LAB_002f42d6;
                            auVar107 = ZEXT1664(auVar77);
                            auVar123 = ZEXT1664(auVar149);
                            auVar137 = ZEXT1664(auVar78);
                            (*pRVar67->filter)(&local_16d0);
                            auVar94._8_56_ = extraout_var_00;
                            auVar94._0_8_ = extraout_XMM1_Qa_00;
                            if (*local_16d0.valid != 0) goto LAB_002f42d6;
                          }
                          else {
                            auVar107 = ZEXT464((uint)local_1700);
                            auVar123 = ZEXT464((uint)local_16fc);
                            auVar137 = ZEXT464((uint)local_16f8);
                            (*pGVar65->occlusionFilterN)(&local_16d0);
                            auVar78 = auVar137._0_16_;
                            auVar149 = auVar123._0_16_;
                            auVar77 = auVar107._0_16_;
                            auVar94._8_56_ = extraout_var;
                            auVar94._0_8_ = extraout_XMM1_Qa;
                            pRVar67 = (RTCIntersectArguments *)local_17c0._0_8_;
                            if (*local_16d0.valid != 0) goto LAB_002f417f;
                          }
                          local_1838->tfar = (float)local_16a0._0_4_;
                          uVar70 = local_1820._0_8_ ^ 1L << (local_1780 & 0x3f);
                          lVar72 = 0;
                          if (uVar70 != 0) {
                            for (; (uVar70 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                            }
                          }
                          pGVar65 = (Geometry *)local_17e0._0_8_;
                          pRVar67 = (RTCIntersectArguments *)local_17c0._0_8_;
                        } while (uVar70 != 0);
                      }
                    }
                  }
                }
                local_1720 = local_1720 & local_1720 - 1;
                auVar303 = ZEXT3264(local_1500);
                context = local_1840;
                ray = local_1838;
                uVar70 = local_1750;
                uVar73 = local_1758;
              } while (local_1720 != 0);
            }
            auVar287 = ZEXT3264(local_15e0);
            auVar284 = ZEXT3264(local_15c0);
            auVar275 = ZEXT3264(local_1600);
            auVar159 = ZEXT3264(local_1620);
            local_1738 = local_1738 + 1;
            auVar172 = ZEXT3264(local_14a0);
            auVar202 = ZEXT3264(_local_1560);
            auVar225 = ZEXT3264(_local_1580);
            auVar238 = ZEXT3264(_local_15a0);
            auVar254 = ZEXT3264(local_14c0);
            auVar271 = ZEXT3264(local_14e0);
          } while (local_1738 != local_1730);
        }
LAB_002f42be:
      } while (local_1728 != &local_1200);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }